

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx::ConeCurveMiMBIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  byte bVar86;
  long lVar87;
  uint uVar88;
  Scene *pSVar89;
  undefined4 uVar90;
  long lVar91;
  ulong uVar92;
  bool bVar93;
  undefined1 auVar94 [16];
  undefined1 auVar96 [32];
  float fVar103;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar104;
  float fVar105;
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar106 [32];
  float fVar112;
  float fVar118;
  float fVar119;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar120;
  float fVar135;
  undefined1 auVar121 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar136;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar143;
  float fVar144;
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  float fVar158;
  float fVar160;
  undefined1 auVar145 [32];
  float fVar151;
  float fVar153;
  float fVar155;
  float fVar157;
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar164;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar174;
  undefined1 auVar167 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  float fVar200;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar210;
  float fVar216;
  float fVar218;
  float fVar220;
  float fVar222;
  float fVar224;
  float fVar226;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar217;
  float fVar219;
  float fVar221;
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar215 [64];
  float fVar233;
  float fVar234;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  Scene *local_6a8;
  undefined1 (*local_6a0) [16];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  Primitive *local_640;
  size_t local_638;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  uint local_540;
  undefined4 uStack_53c;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined4 uStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar95 [32];
  
  pSVar89 = context->scene;
  uVar88 = line->sharedGeomID;
  pGVar10 = (pSVar89->geometries).items[uVar88].ptr;
  fVar119 = (pGVar10->time_range).lower;
  fVar119 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar119) / ((pGVar10->time_range).upper - fVar119));
  auVar46 = vroundss_avx(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),9);
  auVar46 = vminss_avx(auVar46,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar46 = vmaxss_avx(ZEXT816(0),auVar46);
  uVar2 = (line->v0).field_0.i[0];
  lVar11 = *(long *)&pGVar10[3].time_range.upper;
  lVar87 = (long)(int)auVar46._0_4_ * 0x38;
  lVar12 = *(long *)(lVar11 + lVar87);
  lVar91 = *(long *)(lVar11 + 0x10 + lVar87);
  uVar3 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar12 + lVar91 * (ulong)uVar5);
  uStack_5b0 = *puVar1;
  _local_5c0 = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)uVar2);
  uStack_5a8 = puVar1[1];
  uVar6 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar12 + lVar91 * (ulong)uVar6);
  uStack_5d0 = *puVar1;
  _local_5e0 = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)uVar3);
  uStack_5c8 = puVar1[1];
  uVar7 = (line->v0).field_0.i[6];
  auVar145._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)uVar7);
  auVar145._0_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)uVar4);
  uVar8 = (line->v0).field_0.i[3];
  uVar9 = (line->v0).field_0.i[7];
  auVar165._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)uVar9);
  auVar165._0_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)uVar8);
  auVar175._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar5 + 1));
  auVar175._0_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar2 + 1));
  auVar179._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar6 + 1));
  auVar179._0_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar3 + 1));
  auVar196._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar7 + 1));
  auVar196._0_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar4 + 1));
  auVar201._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar9 + 1));
  auVar201._0_16_ = *(undefined1 (*) [16])(lVar12 + lVar91 * (ulong)(uVar8 + 1));
  lVar12 = *(long *)(lVar11 + 0x38 + lVar87);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar87);
  auVar211._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * lVar11);
  auVar211._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar2 * lVar11);
  auVar228._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * lVar11);
  auVar228._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar3 * lVar11);
  lVar91 = (ulong)uVar7 * lVar11;
  auVar235._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar91);
  auVar235._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar4 * lVar11);
  auVar241._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * lVar11);
  auVar241._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * lVar11);
  auVar122._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * lVar11);
  auVar122._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar2 + 1) * lVar11);
  auVar106._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * lVar11);
  auVar106._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar4 + 1) * lVar11);
  fVar119 = fVar119 - auVar46._0_4_;
  auVar202 = vunpcklps_avx(_local_5c0,auVar145);
  auVar187 = vunpckhps_avx(_local_5c0,auVar145);
  auVar214 = vunpcklps_avx(_local_5e0,auVar165);
  auVar197 = vunpckhps_avx(_local_5e0,auVar165);
  auVar48 = vunpcklps_avx(auVar202,auVar214);
  auVar202 = vunpckhps_avx(auVar202,auVar214);
  auVar49 = vunpcklps_avx(auVar187,auVar197);
  auVar187 = vunpckhps_avx(auVar187,auVar197);
  auVar231 = vunpcklps_avx(auVar175,auVar196);
  auVar197 = vunpckhps_avx(auVar175,auVar196);
  auVar239 = vunpcklps_avx(auVar179,auVar201);
  auVar214 = vunpckhps_avx(auVar179,auVar201);
  auVar50 = vunpcklps_avx(auVar231,auVar239);
  auVar231 = vunpckhps_avx(auVar231,auVar239);
  auVar51 = vunpcklps_avx(auVar197,auVar214);
  auVar197 = vunpckhps_avx(auVar197,auVar214);
  auVar244 = vunpcklps_avx(auVar211,auVar235);
  auVar214 = vunpckhps_avx(auVar211,auVar235);
  auVar52 = vunpcklps_avx(auVar228,auVar241);
  auVar239 = vunpckhps_avx(auVar228,auVar241);
  auVar53 = vunpcklps_avx(auVar244,auVar52);
  auVar244 = vunpckhps_avx(auVar244,auVar52);
  auVar54 = vunpcklps_avx(auVar214,auVar239);
  auVar214 = vunpckhps_avx(auVar214,auVar239);
  auVar55 = vunpcklps_avx(auVar122,auVar106);
  auVar239 = vunpckhps_avx(auVar122,auVar106);
  auVar123._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * lVar11);
  auVar123._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar3 + 1) * lVar11);
  auVar236._16_16_ = *(undefined1 (*) [16])(lVar12 + lVar11 * (ulong)(uVar9 + 1));
  auVar236._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * lVar11);
  auVar96 = vunpcklps_avx(auVar123,auVar236);
  auVar52 = vunpckhps_avx(auVar123,auVar236);
  auVar95 = vunpcklps_avx(auVar55,auVar96);
  auVar55 = vunpckhps_avx(auVar55,auVar96);
  auVar96 = vunpcklps_avx(auVar239,auVar52);
  auVar239 = vunpckhps_avx(auVar239,auVar52);
  auVar46 = vshufps_avx(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),0);
  auVar47 = vshufps_avx(ZEXT416((uint)(1.0 - fVar119)),ZEXT416((uint)(1.0 - fVar119)),0);
  fVar119 = auVar46._0_4_;
  fVar233 = auVar46._4_4_;
  fVar234 = auVar46._8_4_;
  fVar103 = auVar46._12_4_;
  fVar136 = auVar53._28_4_;
  fVar120 = auVar47._0_4_;
  fVar133 = auVar47._4_4_;
  fVar134 = auVar47._8_4_;
  fVar135 = auVar47._12_4_;
  auVar229._0_4_ = auVar53._0_4_ * fVar119 + fVar120 * auVar48._0_4_;
  auVar229._4_4_ = auVar53._4_4_ * fVar233 + fVar133 * auVar48._4_4_;
  auVar229._8_4_ = auVar53._8_4_ * fVar234 + fVar134 * auVar48._8_4_;
  auVar229._12_4_ = auVar53._12_4_ * fVar103 + fVar135 * auVar48._12_4_;
  auVar229._16_4_ = auVar53._16_4_ * fVar119 + fVar120 * auVar48._16_4_;
  auVar229._20_4_ = auVar53._20_4_ * fVar233 + fVar133 * auVar48._20_4_;
  auVar229._24_4_ = auVar53._24_4_ * fVar234 + fVar134 * auVar48._24_4_;
  auVar229._28_4_ = fVar136 + auVar48._28_4_;
  local_5c0._0_4_ = auVar202._0_4_ * fVar120 + fVar119 * auVar244._0_4_;
  local_5c0._4_4_ = auVar202._4_4_ * fVar133 + fVar233 * auVar244._4_4_;
  fStack_5b8 = auVar202._8_4_ * fVar134 + fVar234 * auVar244._8_4_;
  fStack_5b4 = auVar202._12_4_ * fVar135 + fVar103 * auVar244._12_4_;
  uStack_5b0._0_4_ = auVar202._16_4_ * fVar120 + fVar119 * auVar244._16_4_;
  uStack_5b0._4_4_ = auVar202._20_4_ * fVar133 + fVar233 * auVar244._20_4_;
  uStack_5a8._0_4_ = auVar202._24_4_ * fVar134 + fVar234 * auVar244._24_4_;
  fVar162 = fVar136 + auVar244._28_4_;
  uStack_5a8._4_4_ = fVar162;
  auVar176._0_4_ = auVar49._0_4_ * fVar120 + auVar54._0_4_ * fVar119;
  auVar176._4_4_ = auVar49._4_4_ * fVar133 + auVar54._4_4_ * fVar233;
  auVar176._8_4_ = auVar49._8_4_ * fVar134 + auVar54._8_4_ * fVar234;
  auVar176._12_4_ = auVar49._12_4_ * fVar135 + auVar54._12_4_ * fVar103;
  auVar176._16_4_ = auVar49._16_4_ * fVar120 + auVar54._16_4_ * fVar119;
  auVar176._20_4_ = auVar49._20_4_ * fVar133 + auVar54._20_4_ * fVar233;
  auVar176._24_4_ = auVar49._24_4_ * fVar134 + auVar54._24_4_ * fVar234;
  auVar176._28_4_ = fVar136 + auVar54._28_4_;
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = 0x3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar212._16_4_ = 0x3f800000;
  auVar212._20_4_ = 0x3f800000;
  auVar212._24_4_ = 0x3f800000;
  auVar212._28_4_ = 0x3f800000;
  fVar143 = auVar214._0_4_ * fVar119 + fVar120 * auVar187._0_4_;
  fVar150 = auVar214._4_4_ * fVar233 + fVar133 * auVar187._4_4_;
  fVar152 = auVar214._8_4_ * fVar234 + fVar134 * auVar187._8_4_;
  fVar154 = auVar214._12_4_ * fVar103 + fVar135 * auVar187._12_4_;
  fVar156 = auVar214._16_4_ * fVar119 + fVar120 * auVar187._16_4_;
  fVar158 = auVar214._20_4_ * fVar233 + fVar133 * auVar187._20_4_;
  fVar160 = auVar214._24_4_ * fVar234 + fVar134 * auVar187._24_4_;
  fVar163 = auVar214._28_4_ + auVar187._28_4_;
  local_600._0_4_ = fVar120 * auVar50._0_4_ + auVar95._0_4_ * fVar119;
  local_600._4_4_ = fVar133 * auVar50._4_4_ + auVar95._4_4_ * fVar233;
  fStack_5f8 = fVar134 * auVar50._8_4_ + auVar95._8_4_ * fVar234;
  fStack_5f4 = fVar135 * auVar50._12_4_ + auVar95._12_4_ * fVar103;
  fStack_5f0 = fVar120 * auVar50._16_4_ + auVar95._16_4_ * fVar119;
  fStack_5ec = fVar133 * auVar50._20_4_ + auVar95._20_4_ * fVar233;
  fStack_5e8 = fVar134 * auVar50._24_4_ + auVar95._24_4_ * fVar234;
  fStack_5e4 = fVar103 + auVar187._28_4_;
  local_5a0._0_4_ = auVar231._0_4_;
  local_5a0._4_4_ = auVar231._4_4_;
  fStack_598 = auVar231._8_4_;
  fStack_594 = auVar231._12_4_;
  fStack_590 = auVar231._16_4_;
  fStack_58c = auVar231._20_4_;
  fStack_588 = auVar231._24_4_;
  auVar237._0_4_ = auVar55._0_4_ * fVar119 + fVar120 * (float)local_5a0._0_4_;
  auVar237._4_4_ = auVar55._4_4_ * fVar233 + fVar133 * (float)local_5a0._4_4_;
  auVar237._8_4_ = auVar55._8_4_ * fVar234 + fVar134 * fStack_598;
  auVar237._12_4_ = auVar55._12_4_ * fVar103 + fVar135 * fStack_594;
  auVar237._16_4_ = auVar55._16_4_ * fVar119 + fVar120 * fStack_590;
  auVar237._20_4_ = auVar55._20_4_ * fVar233 + fVar133 * fStack_58c;
  auVar237._24_4_ = auVar55._24_4_ * fVar234 + fVar134 * fStack_588;
  auVar237._28_4_ = auVar214._28_4_ + fVar103;
  local_580._0_4_ = auVar51._0_4_;
  local_580._4_4_ = auVar51._4_4_;
  fStack_578 = auVar51._8_4_;
  fStack_574 = auVar51._12_4_;
  fStack_570 = auVar51._16_4_;
  fStack_56c = auVar51._20_4_;
  fStack_568 = auVar51._24_4_;
  auVar243._0_4_ = fVar120 * (float)local_580._0_4_ + fVar119 * auVar96._0_4_;
  auVar243._4_4_ = fVar133 * (float)local_580._4_4_ + fVar233 * auVar96._4_4_;
  auVar243._8_4_ = fVar134 * fStack_578 + fVar234 * auVar96._8_4_;
  auVar243._12_4_ = fVar135 * fStack_574 + fVar103 * auVar96._12_4_;
  auVar243._16_4_ = fVar120 * fStack_570 + fVar119 * auVar96._16_4_;
  auVar243._20_4_ = fVar133 * fStack_56c + fVar233 * auVar96._20_4_;
  auVar243._24_4_ = fVar134 * fStack_568 + fVar234 * auVar96._24_4_;
  auVar243._28_4_ = fVar103 + auVar96._28_4_;
  local_5e0._0_4_ = auVar197._0_4_;
  local_5e0._4_4_ = auVar197._4_4_;
  fStack_5d8 = auVar197._8_4_;
  fStack_5d4 = auVar197._12_4_;
  uStack_5d0._0_4_ = auVar197._16_4_;
  uStack_5d0._4_4_ = auVar197._20_4_;
  uStack_5c8._0_4_ = auVar197._24_4_;
  auVar94._0_4_ = fVar120 * (float)local_5e0._0_4_ + fVar119 * auVar239._0_4_;
  auVar94._4_4_ = fVar133 * (float)local_5e0._4_4_ + fVar233 * auVar239._4_4_;
  auVar94._8_4_ = fVar134 * fStack_5d8 + fVar234 * auVar239._8_4_;
  auVar94._12_4_ = fVar135 * fStack_5d4 + fVar103 * auVar239._12_4_;
  auVar95._16_4_ = fVar120 * (float)uStack_5d0 + fVar119 * auVar239._16_4_;
  auVar95._0_16_ = auVar94;
  auVar95._20_4_ = fVar133 * uStack_5d0._4_4_ + fVar233 * auVar239._20_4_;
  auVar95._24_4_ = fVar134 * (float)uStack_5c8 + fVar234 * auVar239._24_4_;
  auVar95._28_4_ = auVar96._28_4_ + auVar239._28_4_;
  auVar46 = vpcmpeqd_avx(auVar94,auVar94);
  auVar47 = vpcmpeqd_avx(auVar46,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar46 = vpcmpeqd_avx(auVar46,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_350 = vshufps_avx(ZEXT416(uVar88),ZEXT416(uVar88),0);
  local_360 = local_350;
  fStack_418 = *(float *)(ray + k * 4 + 0x80);
  fStack_4e4 = *(float *)(ray + k * 4 + 0xa0);
  local_580._4_4_ = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar121 = ZEXT416((uint)(fStack_418 * fStack_418 +
                           fStack_4e4 * fStack_4e4 + (float)local_580._4_4_ * (float)local_580._4_4_
                           ));
  auVar121 = vshufps_avx(auVar121,auVar121,0);
  auVar124._16_16_ = auVar121;
  auVar124._0_16_ = auVar121;
  auVar187 = vrcpps_avx(auVar124);
  auVar96._16_16_ = auVar46;
  auVar96._0_16_ = auVar47;
  fVar120 = auVar187._0_4_;
  fVar133 = auVar187._4_4_;
  auVar197._4_4_ = fVar133 * auVar121._4_4_;
  auVar197._0_4_ = fVar120 * auVar121._0_4_;
  fVar134 = auVar187._8_4_;
  auVar197._8_4_ = fVar134 * auVar121._8_4_;
  fVar135 = auVar187._12_4_;
  auVar197._12_4_ = fVar135 * auVar121._12_4_;
  fVar140 = auVar187._16_4_;
  auVar197._16_4_ = fVar140 * auVar121._0_4_;
  fVar141 = auVar187._20_4_;
  auVar197._20_4_ = fVar141 * auVar121._4_4_;
  fVar142 = auVar187._24_4_;
  auVar197._24_4_ = fVar142 * auVar121._8_4_;
  auVar197._28_4_ = auVar46._12_4_;
  auVar197 = vsubps_avx(auVar212,auVar197);
  fVar103 = auVar187._28_4_ + auVar197._28_4_;
  auVar214._4_4_ = (auVar229._4_4_ + (float)local_600._4_4_) * 0.5;
  auVar214._0_4_ = (auVar229._0_4_ + (float)local_600._0_4_) * 0.5;
  auVar214._8_4_ = (auVar229._8_4_ + fStack_5f8) * 0.5;
  auVar214._12_4_ = (auVar229._12_4_ + fStack_5f4) * 0.5;
  auVar214._16_4_ = (auVar229._16_4_ + fStack_5f0) * 0.5;
  auVar214._20_4_ = (auVar229._20_4_ + fStack_5ec) * 0.5;
  auVar214._24_4_ = (auVar229._24_4_ + fStack_5e8) * 0.5;
  auVar214._28_4_ = auVar229._28_4_ + fStack_5e4;
  auVar187._4_4_ = (auVar237._4_4_ + (float)local_5c0._4_4_) * 0.5;
  auVar187._0_4_ = (auVar237._0_4_ + (float)local_5c0._0_4_) * 0.5;
  auVar187._8_4_ = (auVar237._8_4_ + fStack_5b8) * 0.5;
  auVar187._12_4_ = (auVar237._12_4_ + fStack_5b4) * 0.5;
  auVar187._16_4_ = (auVar237._16_4_ + (float)uStack_5b0) * 0.5;
  auVar187._20_4_ = (auVar237._20_4_ + uStack_5b0._4_4_) * 0.5;
  auVar187._24_4_ = (auVar237._24_4_ + (float)uStack_5a8) * 0.5;
  auVar187._28_4_ = auVar237._28_4_ + fVar162;
  auVar202._4_4_ = (auVar243._4_4_ + auVar176._4_4_) * 0.5;
  auVar202._0_4_ = (auVar243._0_4_ + auVar176._0_4_) * 0.5;
  auVar202._8_4_ = (auVar243._8_4_ + auVar176._8_4_) * 0.5;
  auVar202._12_4_ = (auVar243._12_4_ + auVar176._12_4_) * 0.5;
  auVar202._16_4_ = (auVar243._16_4_ + auVar176._16_4_) * 0.5;
  auVar202._20_4_ = (auVar243._20_4_ + auVar176._20_4_) * 0.5;
  auVar202._24_4_ = (auVar243._24_4_ + auVar176._24_4_) * 0.5;
  auVar202._28_4_ = 0x3f000000;
  fVar119 = *(float *)(ray + k * 4 + 0x20);
  auVar166._4_4_ = fVar119;
  auVar166._0_4_ = fVar119;
  auVar166._8_4_ = fVar119;
  auVar166._12_4_ = fVar119;
  auVar166._16_4_ = fVar119;
  auVar166._20_4_ = fVar119;
  auVar166._24_4_ = fVar119;
  auVar166._28_4_ = fVar119;
  auVar187 = vsubps_avx(auVar187,auVar166);
  fVar233 = *(float *)(ray + k * 4 + 0x40);
  auVar180._4_4_ = fVar233;
  auVar180._0_4_ = fVar233;
  auVar180._8_4_ = fVar233;
  auVar180._12_4_ = fVar233;
  auVar180._16_4_ = fVar233;
  auVar180._20_4_ = fVar233;
  auVar180._24_4_ = fVar233;
  auVar180._28_4_ = fVar233;
  auVar202 = vsubps_avx(auVar202,auVar180);
  fVar136 = auVar187._28_4_ + auVar202._28_4_;
  fVar234 = *(float *)(ray + k * 4);
  auVar137._4_4_ = fVar234;
  auVar137._0_4_ = fVar234;
  auVar137._8_4_ = fVar234;
  auVar137._12_4_ = fVar234;
  auVar137._16_4_ = fVar234;
  auVar137._20_4_ = fVar234;
  auVar137._24_4_ = fVar234;
  auVar137._28_4_ = fVar234;
  auVar214 = vsubps_avx(auVar214,auVar137);
  fStack_684 = auVar214._28_4_ + fVar136;
  fVar104 = (fStack_418 * auVar214._0_4_ +
            fStack_4e4 * auVar187._0_4_ + (float)local_580._4_4_ * auVar202._0_4_) *
            (fVar120 + fVar120 * auVar197._0_4_);
  fVar111 = (fStack_418 * auVar214._4_4_ +
            fStack_4e4 * auVar187._4_4_ + (float)local_580._4_4_ * auVar202._4_4_) *
            (fVar133 + fVar133 * auVar197._4_4_);
  fStack_698 = (fStack_418 * auVar214._8_4_ +
               fStack_4e4 * auVar187._8_4_ + (float)local_580._4_4_ * auVar202._8_4_) *
               (fVar134 + fVar134 * auVar197._8_4_);
  fStack_694 = (fStack_418 * auVar214._12_4_ +
               fStack_4e4 * auVar187._12_4_ + (float)local_580._4_4_ * auVar202._12_4_) *
               (fVar135 + fVar135 * auVar197._12_4_);
  fStack_690 = (fStack_418 * auVar214._16_4_ +
               fStack_4e4 * auVar187._16_4_ + (float)local_580._4_4_ * auVar202._16_4_) *
               (fVar140 + fVar140 * auVar197._16_4_);
  fStack_68c = (fStack_418 * auVar214._20_4_ +
               fStack_4e4 * auVar187._20_4_ + (float)local_580._4_4_ * auVar202._20_4_) *
               (fVar141 + fVar141 * auVar197._20_4_);
  fStack_688 = (fStack_418 * auVar214._24_4_ +
               fStack_4e4 * auVar187._24_4_ + (float)local_580._4_4_ * auVar202._24_4_) *
               (fVar142 + fVar142 * auVar197._24_4_);
  auVar213._0_4_ = fVar234 + fStack_418 * fVar104;
  auVar213._4_4_ = fVar234 + fStack_418 * fVar111;
  auVar213._8_4_ = fVar234 + fStack_418 * fStack_698;
  auVar213._12_4_ = fVar234 + fStack_418 * fStack_694;
  auVar213._16_4_ = fVar234 + fStack_418 * fStack_690;
  auVar213._20_4_ = fVar234 + fStack_418 * fStack_68c;
  auVar213._24_4_ = fVar234 + fStack_418 * fStack_688;
  auVar213._28_4_ = fVar234 + fVar103;
  auVar138._0_4_ = fVar119 + fStack_4e4 * fVar104;
  auVar138._4_4_ = fVar119 + fStack_4e4 * fVar111;
  auVar138._8_4_ = fVar119 + fStack_4e4 * fStack_698;
  auVar138._12_4_ = fVar119 + fStack_4e4 * fStack_694;
  auVar138._16_4_ = fVar119 + fStack_4e4 * fStack_690;
  auVar138._20_4_ = fVar119 + fStack_4e4 * fStack_68c;
  auVar138._24_4_ = fVar119 + fStack_4e4 * fStack_688;
  auVar138._28_4_ = fVar119 + fVar103;
  auVar242._0_4_ = fVar233 + (float)local_580._4_4_ * fVar104;
  auVar242._4_4_ = fVar233 + (float)local_580._4_4_ * fVar111;
  auVar242._8_4_ = fVar233 + (float)local_580._4_4_ * fStack_698;
  auVar242._12_4_ = fVar233 + (float)local_580._4_4_ * fStack_694;
  auVar242._16_4_ = fVar233 + (float)local_580._4_4_ * fStack_690;
  auVar242._20_4_ = fVar233 + (float)local_580._4_4_ * fStack_68c;
  auVar242._24_4_ = fVar233 + (float)local_580._4_4_ * fStack_688;
  auVar242._28_4_ = fVar233 + fVar103;
  local_3a0 = vsubps_avx(auVar237,_local_5c0);
  _local_5a0 = vsubps_avx(auVar243,auVar176);
  fVar233 = local_5a0._0_4_;
  fVar134 = local_5a0._4_4_;
  fVar16 = local_5a0._8_4_;
  fVar22 = local_5a0._12_4_;
  fVar28 = local_5a0._16_4_;
  fVar34 = local_5a0._20_4_;
  fVar40 = local_5a0._24_4_;
  fVar234 = local_3a0._0_4_;
  fVar135 = local_3a0._4_4_;
  fVar17 = local_3a0._8_4_;
  fVar23 = local_3a0._12_4_;
  fVar29 = local_3a0._16_4_;
  fVar35 = local_3a0._20_4_;
  fVar41 = local_3a0._24_4_;
  local_4e0 = vsubps_avx(_local_600,auVar229);
  fVar103 = local_4e0._0_4_;
  fVar140 = local_4e0._4_4_;
  fVar18 = local_4e0._8_4_;
  fVar24 = local_4e0._12_4_;
  fVar30 = local_4e0._16_4_;
  fVar36 = local_4e0._20_4_;
  fVar42 = local_4e0._24_4_;
  fVar105 = fVar103 * fVar103 + fVar234 * fVar234 + fVar233 * fVar233;
  fVar112 = fVar140 * fVar140 + fVar135 * fVar135 + fVar134 * fVar134;
  fVar113 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  fVar114 = fVar24 * fVar24 + fVar23 * fVar23 + fVar22 * fVar22;
  fVar115 = fVar30 * fVar30 + fVar29 * fVar29 + fVar28 * fVar28;
  fVar116 = fVar36 * fVar36 + fVar35 * fVar35 + fVar34 * fVar34;
  fVar117 = fVar42 * fVar42 + fVar41 * fVar41 + fVar40 * fVar40;
  fVar118 = fStack_5e4 + fVar136 + fStack_684;
  local_680 = vsubps_avx(auVar138,_local_5c0);
  local_4c0 = vsubps_avx(auVar242,auVar176);
  fVar210 = local_4c0._0_4_;
  fVar216 = local_4c0._4_4_;
  fVar218 = local_4c0._8_4_;
  fVar220 = local_4c0._12_4_;
  fVar222 = local_4c0._16_4_;
  fVar224 = local_4c0._20_4_;
  fVar226 = local_4c0._24_4_;
  fVar136 = local_680._0_4_;
  fVar141 = local_680._4_4_;
  fVar19 = local_680._8_4_;
  fVar25 = local_680._12_4_;
  fVar31 = local_680._16_4_;
  fVar37 = local_680._20_4_;
  fVar43 = local_680._24_4_;
  _local_5c0 = vsubps_avx(auVar213,auVar229);
  fVar120 = local_5c0._0_4_;
  fVar142 = local_5c0._4_4_;
  fVar20 = local_5c0._8_4_;
  fVar26 = local_5c0._12_4_;
  fVar32 = local_5c0._16_4_;
  fVar38 = local_5c0._20_4_;
  fVar44 = local_5c0._24_4_;
  fVar164 = fVar103 * fVar120 + fVar234 * fVar136 + fVar210 * fVar233;
  fVar168 = fVar140 * fVar142 + fVar135 * fVar141 + fVar216 * fVar134;
  fVar169 = fVar18 * fVar20 + fVar17 * fVar19 + fVar218 * fVar16;
  fVar170 = fVar24 * fVar26 + fVar23 * fVar25 + fVar220 * fVar22;
  fVar171 = fVar30 * fVar32 + fVar29 * fVar31 + fVar222 * fVar28;
  fVar172 = fVar36 * fVar38 + fVar35 * fVar37 + fVar224 * fVar34;
  fVar173 = fVar42 * fVar44 + fVar41 * fVar43 + fVar226 * fVar40;
  fVar174 = fStack_5e4 + fStack_5e4 + fVar118;
  fVar119 = fStack_5e4 + fStack_5e4 + fVar118;
  auVar230._0_4_ = fVar103 * fStack_418 + fVar234 * fStack_4e4 + (float)local_580._4_4_ * fVar233;
  auVar230._4_4_ = fVar140 * fStack_418 + fVar135 * fStack_4e4 + (float)local_580._4_4_ * fVar134;
  auVar230._8_4_ = fVar18 * fStack_418 + fVar17 * fStack_4e4 + (float)local_580._4_4_ * fVar16;
  auVar230._12_4_ = fVar24 * fStack_418 + fVar23 * fStack_4e4 + (float)local_580._4_4_ * fVar22;
  auVar230._16_4_ = fVar30 * fStack_418 + fVar29 * fStack_4e4 + (float)local_580._4_4_ * fVar28;
  auVar230._20_4_ = fVar36 * fStack_418 + fVar35 * fStack_4e4 + (float)local_580._4_4_ * fVar34;
  auVar230._24_4_ = fVar42 * fStack_418 + fVar41 * fStack_4e4 + (float)local_580._4_4_ * fVar40;
  auVar230._28_4_ = fStack_5e4 + fVar119;
  local_580._0_4_ = local_580._4_4_;
  fStack_578 = (float)local_580._4_4_;
  fStack_574 = (float)local_580._4_4_;
  fStack_570 = (float)local_580._4_4_;
  fStack_56c = (float)local_580._4_4_;
  fStack_568 = (float)local_580._4_4_;
  fStack_564 = (float)local_580._4_4_;
  _local_420 = CONCAT44(fStack_418,fStack_418);
  auVar54._4_4_ = fVar112;
  auVar54._0_4_ = fVar105;
  auVar54._8_4_ = fVar113;
  auVar54._12_4_ = fVar114;
  auVar54._16_4_ = fVar115;
  auVar54._20_4_ = fVar116;
  auVar54._24_4_ = fVar117;
  auVar54._28_4_ = fVar118;
  auVar53._4_4_ = fVar150;
  auVar53._0_4_ = fVar143;
  auVar53._8_4_ = fVar152;
  auVar53._12_4_ = fVar154;
  auVar53._16_4_ = fVar156;
  auVar53._20_4_ = fVar158;
  auVar53._24_4_ = fVar160;
  auVar53._28_4_ = fVar163;
  auVar187 = vsubps_avx(auVar53,auVar95);
  fVar133 = auVar187._0_4_;
  fVar15 = auVar187._4_4_;
  fVar21 = auVar187._8_4_;
  fVar27 = auVar187._12_4_;
  fVar33 = auVar187._16_4_;
  fVar39 = auVar187._20_4_;
  fVar45 = auVar187._24_4_;
  local_3c0 = fVar105 + fVar133 * fVar133;
  fStack_3bc = fVar112 + fVar15 * fVar15;
  fStack_3b8 = fVar113 + fVar21 * fVar21;
  fStack_3b4 = fVar114 + fVar27 * fVar27;
  fStack_3b0 = fVar115 + fVar33 * fVar33;
  fStack_3ac = fVar116 + fVar39 * fVar39;
  fStack_3a8 = fVar117 + fVar45 * fVar45;
  fVar144 = fVar105 * fVar105;
  fVar151 = fVar112 * fVar112;
  local_260._4_4_ = fVar151;
  local_260._0_4_ = fVar144;
  fVar153 = fVar113 * fVar113;
  fStack_258 = fVar153;
  fVar155 = fVar114 * fVar114;
  fStack_254 = fVar155;
  fVar157 = fVar115 * fVar115;
  fStack_250 = fVar157;
  fVar159 = fVar116 * fVar116;
  fStack_24c = fVar159;
  fVar161 = fVar117 * fVar117;
  fStack_248 = fVar161;
  uStack_244 = fVar162;
  auVar231._4_4_ =
       fVar151 * (fStack_418 * fVar142 + fStack_4e4 * fVar141 + (float)local_580._4_4_ * fVar216);
  auVar231._0_4_ =
       fVar144 * (fStack_418 * fVar120 + fStack_4e4 * fVar136 + (float)local_580._4_4_ * fVar210);
  auVar231._8_4_ =
       fVar153 * (fStack_418 * fVar20 + fStack_4e4 * fVar19 + (float)local_580._4_4_ * fVar218);
  auVar231._12_4_ =
       fVar155 * (fStack_418 * fVar26 + fStack_4e4 * fVar25 + (float)local_580._4_4_ * fVar220);
  auVar231._16_4_ =
       fVar157 * (fStack_418 * fVar32 + fStack_4e4 * fVar31 + (float)local_580._4_4_ * fVar222);
  auVar231._20_4_ =
       fVar159 * (fStack_418 * fVar38 + fStack_4e4 * fVar37 + (float)local_580._4_4_ * fVar224);
  auVar231._24_4_ =
       fVar161 * (fStack_418 * fVar44 + fStack_4e4 * fVar43 + (float)local_580._4_4_ * fVar226);
  auVar231._28_4_ = fStack_5e4 + fStack_5e4 + fVar119;
  fVar56 = local_5a0._28_4_;
  auVar239._4_4_ = fStack_3bc * auVar230._4_4_ * fVar168;
  auVar239._0_4_ = local_3c0 * auVar230._0_4_ * fVar164;
  auVar239._8_4_ = fStack_3b8 * auVar230._8_4_ * fVar169;
  auVar239._12_4_ = fStack_3b4 * auVar230._12_4_ * fVar170;
  auVar239._16_4_ = fStack_3b0 * auVar230._16_4_ * fVar171;
  auVar239._20_4_ = fStack_3ac * auVar230._20_4_ * fVar172;
  auVar239._24_4_ = fStack_3a8 * auVar230._24_4_ * fVar173;
  auVar239._28_4_ = fVar56;
  auVar197 = vsubps_avx(auVar231,auVar239);
  fVar178 = fVar143 * fVar105;
  fVar190 = fVar150 * fVar112;
  auVar244._4_4_ = fVar190;
  auVar244._0_4_ = fVar178;
  fVar191 = fVar152 * fVar113;
  auVar244._8_4_ = fVar191;
  fVar192 = fVar154 * fVar114;
  auVar244._12_4_ = fVar192;
  fVar193 = fVar156 * fVar115;
  auVar244._16_4_ = fVar193;
  fVar194 = fVar158 * fVar116;
  auVar244._20_4_ = fVar194;
  fVar195 = fVar160 * fVar117;
  auVar244._24_4_ = fVar195;
  auVar244._28_4_ = fVar56;
  auVar107._0_4_ = auVar230._0_4_ * fVar133 * fVar178 + auVar197._0_4_;
  auVar107._4_4_ = auVar230._4_4_ * fVar15 * fVar190 + auVar197._4_4_;
  auVar107._8_4_ = auVar230._8_4_ * fVar21 * fVar191 + auVar197._8_4_;
  auVar107._12_4_ = auVar230._12_4_ * fVar27 * fVar192 + auVar197._12_4_;
  auVar107._16_4_ = auVar230._16_4_ * fVar33 * fVar193 + auVar197._16_4_;
  auVar107._20_4_ = auVar230._20_4_ * fVar39 * fVar194 + auVar197._20_4_;
  auVar107._24_4_ = auVar230._24_4_ * fVar45 * fVar195 + auVar197._24_4_;
  auVar107._28_4_ = fVar163 + auVar197._28_4_;
  auVar52._4_4_ = fVar151 * (fVar142 * fVar142 + fVar141 * fVar141 + fVar216 * fVar216);
  auVar52._0_4_ = fVar144 * (fVar120 * fVar120 + fVar136 * fVar136 + fVar210 * fVar210);
  auVar52._8_4_ = fVar153 * (fVar20 * fVar20 + fVar19 * fVar19 + fVar218 * fVar218);
  auVar52._12_4_ = fVar155 * (fVar26 * fVar26 + fVar25 * fVar25 + fVar220 * fVar220);
  auVar52._16_4_ = fVar157 * (fVar32 * fVar32 + fVar31 * fVar31 + fVar222 * fVar222);
  auVar52._20_4_ = fVar159 * (fVar38 * fVar38 + fVar37 * fVar37 + fVar224 * fVar224);
  auVar52._24_4_ = fVar161 * (fVar44 * fVar44 + fVar43 * fVar43 + fVar226 * fVar226);
  auVar52._28_4_ = fVar162 + fVar162 + fStack_5e4;
  auVar55._4_4_ = fVar168 * fVar168 * fStack_3bc;
  auVar55._0_4_ = fVar164 * fVar164 * local_3c0;
  auVar55._8_4_ = fVar169 * fVar169 * fStack_3b8;
  auVar55._12_4_ = fVar170 * fVar170 * fStack_3b4;
  auVar55._16_4_ = fVar171 * fVar171 * fStack_3b0;
  auVar55._20_4_ = fVar172 * fVar172 * fStack_3ac;
  auVar55._24_4_ = fVar173 * fVar173 * fStack_3a8;
  auVar55._28_4_ = fVar163;
  auVar197 = vsubps_avx(auVar52,auVar55);
  fVar119 = auVar187._28_4_;
  auVar48._4_4_ = (fVar15 + fVar15) * fVar168;
  auVar48._0_4_ = (fVar133 + fVar133) * fVar164;
  auVar48._8_4_ = (fVar21 + fVar21) * fVar169;
  auVar48._12_4_ = (fVar27 + fVar27) * fVar170;
  auVar48._16_4_ = (fVar33 + fVar33) * fVar171;
  auVar48._20_4_ = (fVar39 + fVar39) * fVar172;
  auVar48._24_4_ = (fVar45 + fVar45) * fVar173;
  auVar48._28_4_ = fVar119 + fVar119;
  auVar187 = vsubps_avx(auVar48,auVar244);
  fVar162 = auVar230._0_4_ * auVar230._0_4_;
  fVar217 = auVar230._4_4_ * auVar230._4_4_;
  fVar219 = auVar230._8_4_ * auVar230._8_4_;
  fVar221 = auVar230._12_4_ * auVar230._12_4_;
  fVar223 = auVar230._16_4_ * auVar230._16_4_;
  fVar225 = auVar230._20_4_ * auVar230._20_4_;
  fStack_644 = local_4c0._28_4_;
  fVar227 = auVar230._24_4_ * auVar230._24_4_;
  auVar49._4_4_ = fVar217 * fStack_3bc;
  auVar49._0_4_ = fVar162 * local_3c0;
  auVar49._8_4_ = fVar219 * fStack_3b8;
  auVar49._12_4_ = fVar221 * fStack_3b4;
  auVar49._16_4_ = fVar223 * fStack_3b0;
  auVar49._20_4_ = fVar225 * fStack_3ac;
  auVar49._24_4_ = fVar227 * fStack_3a8;
  auVar49._28_4_ = fVar56;
  auVar202 = vsubps_avx(_local_260,auVar49);
  auVar50._4_4_ = auVar202._4_4_ * (auVar197._4_4_ + auVar187._4_4_ * fVar190);
  auVar50._0_4_ = auVar202._0_4_ * (auVar197._0_4_ + auVar187._0_4_ * fVar178);
  auVar50._8_4_ = auVar202._8_4_ * (auVar197._8_4_ + auVar187._8_4_ * fVar191);
  auVar50._12_4_ = auVar202._12_4_ * (auVar197._12_4_ + auVar187._12_4_ * fVar192);
  auVar50._16_4_ = auVar202._16_4_ * (auVar197._16_4_ + auVar187._16_4_ * fVar193);
  auVar50._20_4_ = auVar202._20_4_ * (auVar197._20_4_ + auVar187._20_4_ * fVar194);
  auVar50._24_4_ = auVar202._24_4_ * (auVar197._24_4_ + auVar187._24_4_ * fVar195);
  auVar50._28_4_ = auVar197._28_4_ + fVar56;
  auVar51._4_4_ = auVar107._4_4_ * auVar107._4_4_;
  auVar51._0_4_ = auVar107._0_4_ * auVar107._0_4_;
  auVar51._8_4_ = auVar107._8_4_ * auVar107._8_4_;
  auVar51._12_4_ = auVar107._12_4_ * auVar107._12_4_;
  auVar51._16_4_ = auVar107._16_4_ * auVar107._16_4_;
  auVar51._20_4_ = auVar107._20_4_ * auVar107._20_4_;
  auVar51._24_4_ = auVar107._24_4_ * auVar107._24_4_;
  auVar51._28_4_ = fVar56;
  auVar197 = vsubps_avx(auVar51,auVar50);
  auVar187 = vcmpps_avx(auVar197,ZEXT432(0) << 0x20,5);
  auVar214 = auVar187 & ~auVar96;
  uStack_530 = 0;
  uStack_528 = 0;
  if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar214 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar214 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar214 >> 0x7f,0) != '\0') ||
        (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar214 >> 0xbf,0) != '\0') ||
      (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar214[0x1f] < '\0')
  {
    local_280 = fStack_4e4;
    fStack_27c = fStack_4e4;
    fStack_278 = fStack_4e4;
    fStack_274 = fStack_4e4;
    fStack_270 = fStack_4e4;
    fStack_26c = fStack_4e4;
    fStack_268 = fStack_4e4;
    fStack_264 = fStack_4e4;
    auVar214 = vandnps_avx(auVar96,auVar187);
    auVar239 = vsubps_avx(auVar213,_local_600);
    auVar244 = vsubps_avx(auVar138,auVar237);
    auVar52 = vsubps_avx(auVar242,auVar243);
    fVar200 = auVar239._0_4_ * fVar103 + auVar52._0_4_ * fVar233 + fVar234 * auVar244._0_4_;
    fVar204 = auVar239._4_4_ * fVar140 + auVar52._4_4_ * fVar134 + fVar135 * auVar244._4_4_;
    fVar205 = auVar239._8_4_ * fVar18 + auVar52._8_4_ * fVar16 + fVar17 * auVar244._8_4_;
    fVar206 = auVar239._12_4_ * fVar24 + auVar52._12_4_ * fVar22 + fVar23 * auVar244._12_4_;
    fVar207 = auVar239._16_4_ * fVar30 + auVar52._16_4_ * fVar28 + fVar29 * auVar244._16_4_;
    fVar208 = auVar239._20_4_ * fVar36 + auVar52._20_4_ * fVar34 + fVar35 * auVar244._20_4_;
    fVar209 = auVar239._24_4_ * fVar42 + auVar52._24_4_ * fVar40 + fVar41 * auVar244._24_4_;
    auVar197 = vsqrtps_avx(auVar197);
    auVar187 = vrcpps_avx(auVar202);
    fVar178 = auVar187._0_4_;
    fVar190 = auVar187._4_4_;
    auVar57._4_4_ = auVar202._4_4_ * fVar190;
    auVar57._0_4_ = auVar202._0_4_ * fVar178;
    fVar191 = auVar187._8_4_;
    auVar57._8_4_ = auVar202._8_4_ * fVar191;
    fVar192 = auVar187._12_4_;
    auVar57._12_4_ = auVar202._12_4_ * fVar192;
    fVar193 = auVar187._16_4_;
    auVar57._16_4_ = auVar202._16_4_ * fVar193;
    fVar194 = auVar187._20_4_;
    auVar57._20_4_ = auVar202._20_4_ * fVar194;
    fVar195 = auVar187._24_4_;
    auVar57._24_4_ = auVar202._24_4_ * fVar195;
    auVar57._28_4_ = fVar119;
    auVar146._8_4_ = 0x3f800000;
    auVar146._0_8_ = 0x3f8000003f800000;
    auVar146._12_4_ = 0x3f800000;
    auVar146._16_4_ = 0x3f800000;
    auVar146._20_4_ = 0x3f800000;
    auVar146._24_4_ = 0x3f800000;
    auVar146._28_4_ = 0x3f800000;
    auVar187 = vsubps_avx(auVar146,auVar57);
    auVar181._8_4_ = 0x7fffffff;
    auVar181._0_8_ = 0x7fffffff7fffffff;
    auVar181._12_4_ = 0x7fffffff;
    auVar181._16_4_ = 0x7fffffff;
    auVar181._20_4_ = 0x7fffffff;
    auVar181._24_4_ = 0x7fffffff;
    auVar181._28_4_ = 0x7fffffff;
    fVar178 = fVar178 + fVar178 * auVar187._0_4_;
    fVar190 = fVar190 + fVar190 * auVar187._4_4_;
    fVar191 = fVar191 + fVar191 * auVar187._8_4_;
    fVar192 = fVar192 + fVar192 * auVar187._12_4_;
    fVar193 = fVar193 + fVar193 * auVar187._16_4_;
    fVar194 = fVar194 + fVar194 * auVar187._20_4_;
    fVar195 = fVar195 + fVar195 * auVar187._24_4_;
    auVar187 = vandps_avx(auVar202,auVar181);
    auVar182._8_4_ = 0x219392ef;
    auVar182._0_8_ = 0x219392ef219392ef;
    auVar182._12_4_ = 0x219392ef;
    auVar182._16_4_ = 0x219392ef;
    auVar182._20_4_ = 0x219392ef;
    auVar182._24_4_ = 0x219392ef;
    auVar182._28_4_ = 0x219392ef;
    auVar187 = vcmpps_avx(auVar187,auVar182,2);
    uVar92 = CONCAT44(auVar107._4_4_,auVar107._0_4_);
    auVar183._0_8_ = uVar92 ^ 0x8000000080000000;
    auVar183._8_4_ = -auVar107._8_4_;
    auVar183._12_4_ = -auVar107._12_4_;
    auVar183._16_4_ = -auVar107._16_4_;
    auVar183._20_4_ = -auVar107._20_4_;
    auVar183._24_4_ = -auVar107._24_4_;
    auVar183._28_4_ = -auVar107._28_4_;
    auVar202 = vsubps_avx(auVar183,auVar197);
    auVar231 = vsubps_avx(auVar197,auVar107);
    auVar58._4_4_ = auVar202._4_4_ * fVar190;
    auVar58._0_4_ = auVar202._0_4_ * fVar178;
    auVar58._8_4_ = auVar202._8_4_ * fVar191;
    auVar58._12_4_ = auVar202._12_4_ * fVar192;
    auVar58._16_4_ = auVar202._16_4_ * fVar193;
    auVar58._20_4_ = auVar202._20_4_ * fVar194;
    auVar58._24_4_ = auVar202._24_4_ * fVar195;
    auVar58._28_4_ = auVar197._28_4_;
    auVar59._4_4_ = auVar231._4_4_ * fVar190;
    auVar59._0_4_ = auVar231._0_4_ * fVar178;
    auVar59._8_4_ = auVar231._8_4_ * fVar191;
    auVar59._12_4_ = auVar231._12_4_ * fVar192;
    auVar59._16_4_ = auVar231._16_4_ * fVar193;
    auVar59._20_4_ = auVar231._20_4_ * fVar194;
    auVar59._24_4_ = auVar231._24_4_ * fVar195;
    auVar59._28_4_ = auVar231._28_4_;
    auVar97._8_4_ = 0xff800000;
    auVar97._0_8_ = 0xff800000ff800000;
    auVar97._12_4_ = 0xff800000;
    auVar97._16_4_ = 0xff800000;
    auVar97._20_4_ = 0xff800000;
    auVar97._24_4_ = 0xff800000;
    auVar97._28_4_ = 0xff800000;
    auVar197 = vblendvps_avx(auVar58,auVar97,auVar187);
    auVar139._8_4_ = 0x7f800000;
    auVar139._0_8_ = 0x7f8000007f800000;
    auVar139._12_4_ = 0x7f800000;
    auVar139._16_4_ = 0x7f800000;
    auVar139._20_4_ = 0x7f800000;
    auVar139._24_4_ = 0x7f800000;
    auVar139._28_4_ = 0x7f800000;
    auVar202 = vblendvps_avx(auVar59,auVar139,auVar187);
    auVar184._0_4_ = fVar164 + auVar230._0_4_ * auVar197._0_4_;
    auVar184._4_4_ = fVar168 + auVar230._4_4_ * auVar197._4_4_;
    auVar184._8_4_ = fVar169 + auVar230._8_4_ * auVar197._8_4_;
    auVar184._12_4_ = fVar170 + auVar230._12_4_ * auVar197._12_4_;
    auVar184._16_4_ = fVar171 + auVar230._16_4_ * auVar197._16_4_;
    auVar184._20_4_ = fVar172 + auVar230._20_4_ * auVar197._20_4_;
    auVar184._24_4_ = fVar173 + auVar230._24_4_ * auVar197._24_4_;
    auVar184._28_4_ = fVar174 + auVar187._28_4_;
    auVar187 = vcmpps_avx(auVar184,ZEXT832(0) << 0x20,6);
    auVar231 = vcmpps_avx(auVar184,auVar54,1);
    auVar187 = vandps_avx(auVar231,auVar187);
    auVar187 = vandps_avx(auVar214,auVar187);
    local_440 = vblendvps_avx(auVar139,auVar197,auVar187);
    local_460._0_4_ = fVar164 + auVar230._0_4_ * auVar202._0_4_;
    local_460._4_4_ = fVar168 + auVar230._4_4_ * auVar202._4_4_;
    fStack_458 = fVar169 + auVar230._8_4_ * auVar202._8_4_;
    fStack_454 = fVar170 + auVar230._12_4_ * auVar202._12_4_;
    fStack_450 = fVar171 + auVar230._16_4_ * auVar202._16_4_;
    fStack_44c = fVar172 + auVar230._20_4_ * auVar202._20_4_;
    fStack_448 = fVar173 + auVar230._24_4_ * auVar202._24_4_;
    register0x0000139c = fVar174 + auVar197._28_4_;
    auVar187 = vcmpps_avx(_local_460,ZEXT832(0) << 0x20,6);
    auVar197 = vcmpps_avx(_local_460,auVar54,1);
    auVar187 = vandps_avx(auVar197,auVar187);
    auVar187 = vandps_avx(auVar214,auVar187);
    _local_600 = vblendvps_avx(auVar97,auVar202,auVar187);
    auVar202 = vrcpps_avx(auVar230);
    fVar119 = auVar202._0_4_;
    fVar178 = auVar202._4_4_;
    auVar60._4_4_ = auVar230._4_4_ * fVar178;
    auVar60._0_4_ = auVar230._0_4_ * fVar119;
    fVar190 = auVar202._8_4_;
    auVar60._8_4_ = auVar230._8_4_ * fVar190;
    fVar191 = auVar202._12_4_;
    auVar60._12_4_ = auVar230._12_4_ * fVar191;
    fVar192 = auVar202._16_4_;
    auVar60._16_4_ = auVar230._16_4_ * fVar192;
    fVar193 = auVar202._20_4_;
    auVar60._20_4_ = auVar230._20_4_ * fVar193;
    fVar194 = auVar202._24_4_;
    auVar60._24_4_ = auVar230._24_4_ * fVar194;
    auVar60._28_4_ = auVar187._28_4_;
    auVar55 = vsubps_avx(auVar146,auVar60);
    fVar119 = fVar119 + fVar119 * auVar55._0_4_;
    fVar178 = fVar178 + fVar178 * auVar55._4_4_;
    fVar190 = fVar190 + fVar190 * auVar55._8_4_;
    fVar191 = fVar191 + fVar191 * auVar55._12_4_;
    fVar192 = fVar192 + fVar192 * auVar55._16_4_;
    fVar193 = fVar193 + fVar193 * auVar55._20_4_;
    fVar194 = fVar194 + fVar194 * auVar55._24_4_;
    auVar61._4_4_ = auVar230._4_4_ * fVar142;
    auVar61._0_4_ = auVar230._0_4_ * fVar120;
    auVar61._8_4_ = auVar230._8_4_ * fVar20;
    auVar61._12_4_ = auVar230._12_4_ * fVar26;
    auVar61._16_4_ = auVar230._16_4_ * fVar32;
    auVar61._20_4_ = auVar230._20_4_ * fVar38;
    auVar61._24_4_ = auVar230._24_4_ * fVar44;
    auVar61._28_4_ = auVar55._28_4_;
    auVar62._4_4_ = fStack_418 * fVar168;
    auVar62._0_4_ = fStack_418 * fVar164;
    auVar62._8_4_ = fStack_418 * fVar169;
    auVar62._12_4_ = fStack_418 * fVar170;
    auVar62._16_4_ = fStack_418 * fVar171;
    auVar62._20_4_ = fStack_418 * fVar172;
    auVar62._24_4_ = fStack_418 * fVar173;
    auVar62._28_4_ = auVar197._28_4_;
    auVar187 = vsubps_avx(auVar61,auVar62);
    auVar63._4_4_ = auVar230._4_4_ * fVar141;
    auVar63._0_4_ = auVar230._0_4_ * fVar136;
    auVar63._8_4_ = auVar230._8_4_ * fVar19;
    auVar63._12_4_ = auVar230._12_4_ * fVar25;
    auVar63._16_4_ = auVar230._16_4_ * fVar31;
    auVar63._20_4_ = auVar230._20_4_ * fVar37;
    auVar63._24_4_ = auVar230._24_4_ * fVar43;
    auVar63._28_4_ = auVar197._28_4_;
    auVar64._4_4_ = fStack_4e4 * fVar168;
    auVar64._0_4_ = fStack_4e4 * fVar164;
    auVar64._8_4_ = fStack_4e4 * fVar169;
    auVar64._12_4_ = fStack_4e4 * fVar170;
    auVar64._16_4_ = fStack_4e4 * fVar171;
    auVar64._20_4_ = fStack_4e4 * fVar172;
    uVar90 = auVar231._28_4_;
    auVar64._24_4_ = fStack_4e4 * fVar173;
    auVar64._28_4_ = uVar90;
    auVar231 = vsubps_avx(auVar63,auVar64);
    auVar65._4_4_ = auVar230._4_4_ * fVar216;
    auVar65._0_4_ = auVar230._0_4_ * fVar210;
    auVar65._8_4_ = auVar230._8_4_ * fVar218;
    auVar65._12_4_ = auVar230._12_4_ * fVar220;
    auVar65._16_4_ = auVar230._16_4_ * fVar222;
    auVar65._20_4_ = auVar230._20_4_ * fVar224;
    auVar65._24_4_ = auVar230._24_4_ * fVar226;
    auVar65._28_4_ = uVar90;
    auVar66._4_4_ = (float)local_580._4_4_ * fVar168;
    auVar66._0_4_ = (float)local_580._4_4_ * fVar164;
    auVar66._8_4_ = (float)local_580._4_4_ * fVar169;
    auVar66._12_4_ = (float)local_580._4_4_ * fVar170;
    auVar66._16_4_ = (float)local_580._4_4_ * fVar171;
    auVar66._20_4_ = (float)local_580._4_4_ * fVar172;
    auVar66._24_4_ = (float)local_580._4_4_ * fVar173;
    auVar66._28_4_ = 0x3f800000;
    auVar197 = vsubps_avx(auVar65,auVar66);
    auVar125._0_4_ =
         auVar187._0_4_ * auVar187._0_4_ +
         auVar231._0_4_ * auVar231._0_4_ + auVar197._0_4_ * auVar197._0_4_;
    auVar125._4_4_ =
         auVar187._4_4_ * auVar187._4_4_ +
         auVar231._4_4_ * auVar231._4_4_ + auVar197._4_4_ * auVar197._4_4_;
    auVar125._8_4_ =
         auVar187._8_4_ * auVar187._8_4_ +
         auVar231._8_4_ * auVar231._8_4_ + auVar197._8_4_ * auVar197._8_4_;
    auVar125._12_4_ =
         auVar187._12_4_ * auVar187._12_4_ +
         auVar231._12_4_ * auVar231._12_4_ + auVar197._12_4_ * auVar197._12_4_;
    auVar125._16_4_ =
         auVar187._16_4_ * auVar187._16_4_ +
         auVar231._16_4_ * auVar231._16_4_ + auVar197._16_4_ * auVar197._16_4_;
    auVar125._20_4_ =
         auVar187._20_4_ * auVar187._20_4_ +
         auVar231._20_4_ * auVar231._20_4_ + auVar197._20_4_ * auVar197._20_4_;
    auVar125._24_4_ =
         auVar187._24_4_ * auVar187._24_4_ +
         auVar231._24_4_ * auVar231._24_4_ + auVar197._24_4_ * auVar197._24_4_;
    auVar125._28_4_ = auVar187._28_4_ + auVar231._28_4_ + auVar197._28_4_;
    auVar67._4_4_ = fVar217 * fVar150 * fVar150;
    auVar67._0_4_ = fVar162 * fVar143 * fVar143;
    auVar67._8_4_ = fVar219 * fVar152 * fVar152;
    auVar67._12_4_ = fVar221 * fVar154 * fVar154;
    auVar67._16_4_ = fVar223 * fVar156 * fVar156;
    auVar67._20_4_ = fVar225 * fVar158 * fVar158;
    auVar67._24_4_ = fVar227 * fVar160 * fVar160;
    auVar67._28_4_ = fVar163;
    auVar187 = vcmpps_avx(auVar125,auVar67,1);
    auVar68._4_4_ = fVar178 * -fVar168;
    auVar68._0_4_ = fVar119 * -fVar164;
    auVar68._8_4_ = fVar190 * -fVar169;
    auVar68._12_4_ = fVar191 * -fVar170;
    auVar68._16_4_ = fVar192 * -fVar171;
    auVar68._20_4_ = fVar193 * -fVar172;
    auVar68._24_4_ = fVar194 * -fVar173;
    auVar68._28_4_ = -fVar174;
    auVar197 = vblendvps_avx(auVar139,auVar68,auVar187);
    auVar147._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar147._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar187 = vandnps_avx(auVar147,auVar214);
    _local_5e0 = vblendvps_avx(auVar139,auVar197,auVar187);
    auVar126._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar126._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar69._4_4_ = auVar230._4_4_ * auVar239._4_4_;
    auVar69._0_4_ = auVar230._0_4_ * auVar239._0_4_;
    auVar69._8_4_ = auVar230._8_4_ * auVar239._8_4_;
    auVar69._12_4_ = auVar230._12_4_ * auVar239._12_4_;
    auVar69._16_4_ = auVar230._16_4_ * auVar239._16_4_;
    auVar69._20_4_ = auVar230._20_4_ * auVar239._20_4_;
    auVar69._24_4_ = auVar230._24_4_ * auVar239._24_4_;
    auVar69._28_4_ = auVar187._28_4_;
    auVar70._4_4_ = auVar230._4_4_ * auVar244._4_4_;
    auVar70._0_4_ = auVar230._0_4_ * auVar244._0_4_;
    auVar70._8_4_ = auVar230._8_4_ * auVar244._8_4_;
    auVar70._12_4_ = auVar230._12_4_ * auVar244._12_4_;
    auVar70._16_4_ = auVar230._16_4_ * auVar244._16_4_;
    auVar70._20_4_ = auVar230._20_4_ * auVar244._20_4_;
    auVar70._24_4_ = auVar230._24_4_ * auVar244._24_4_;
    auVar70._28_4_ = auVar231._28_4_;
    auVar98._0_4_ = auVar230._0_4_ * auVar52._0_4_;
    auVar98._4_4_ = auVar230._4_4_ * auVar52._4_4_;
    auVar98._8_4_ = auVar230._8_4_ * auVar52._8_4_;
    auVar98._12_4_ = auVar230._12_4_ * auVar52._12_4_;
    auVar98._16_4_ = auVar230._16_4_ * auVar52._16_4_;
    auVar98._20_4_ = auVar230._20_4_ * auVar52._20_4_;
    auVar98._24_4_ = auVar230._24_4_ * auVar52._24_4_;
    auVar98._28_4_ = 0;
    auVar71._4_4_ = fStack_418 * fVar204;
    auVar71._0_4_ = fStack_418 * fVar200;
    auVar71._8_4_ = fStack_418 * fVar205;
    auVar71._12_4_ = fStack_418 * fVar206;
    auVar71._16_4_ = fStack_418 * fVar207;
    auVar71._20_4_ = fStack_418 * fVar208;
    auVar71._24_4_ = fStack_418 * fVar209;
    auVar71._28_4_ = uVar90;
    auVar187 = vsubps_avx(auVar69,auVar71);
    auVar72._4_4_ = fStack_4e4 * fVar204;
    auVar72._0_4_ = fStack_4e4 * fVar200;
    auVar72._8_4_ = fStack_4e4 * fVar205;
    auVar72._12_4_ = fStack_4e4 * fVar206;
    auVar72._16_4_ = fStack_4e4 * fVar207;
    auVar72._20_4_ = fStack_4e4 * fVar208;
    auVar72._24_4_ = fStack_4e4 * fVar209;
    auVar72._28_4_ = uVar90;
    auVar197 = vsubps_avx(auVar70,auVar72);
    auVar73._4_4_ = (float)local_580._4_4_ * fVar204;
    auVar73._0_4_ = (float)local_580._4_4_ * fVar200;
    auVar73._8_4_ = (float)local_580._4_4_ * fVar205;
    auVar73._12_4_ = (float)local_580._4_4_ * fVar206;
    auVar73._16_4_ = (float)local_580._4_4_ * fVar207;
    auVar73._20_4_ = (float)local_580._4_4_ * fVar208;
    auVar73._24_4_ = (float)local_580._4_4_ * fVar209;
    auVar73._28_4_ = uVar90;
    auVar231 = vsubps_avx(auVar98,auVar73);
    auVar99._0_4_ =
         auVar187._0_4_ * auVar187._0_4_ +
         auVar197._0_4_ * auVar197._0_4_ + auVar231._0_4_ * auVar231._0_4_;
    auVar99._4_4_ =
         auVar187._4_4_ * auVar187._4_4_ +
         auVar197._4_4_ * auVar197._4_4_ + auVar231._4_4_ * auVar231._4_4_;
    auVar99._8_4_ =
         auVar187._8_4_ * auVar187._8_4_ +
         auVar197._8_4_ * auVar197._8_4_ + auVar231._8_4_ * auVar231._8_4_;
    auVar99._12_4_ =
         auVar187._12_4_ * auVar187._12_4_ +
         auVar197._12_4_ * auVar197._12_4_ + auVar231._12_4_ * auVar231._12_4_;
    auVar99._16_4_ =
         auVar187._16_4_ * auVar187._16_4_ +
         auVar197._16_4_ * auVar197._16_4_ + auVar231._16_4_ * auVar231._16_4_;
    auVar99._20_4_ =
         auVar187._20_4_ * auVar187._20_4_ +
         auVar197._20_4_ * auVar197._20_4_ + auVar231._20_4_ * auVar231._20_4_;
    auVar99._24_4_ =
         auVar187._24_4_ * auVar187._24_4_ +
         auVar197._24_4_ * auVar197._24_4_ + auVar231._24_4_ * auVar231._24_4_;
    auVar99._28_4_ = auVar187._28_4_ + auVar197._28_4_ + auVar231._28_4_;
    auVar74._4_4_ = fVar217 * auVar94._4_4_ * auVar94._4_4_;
    auVar74._0_4_ = fVar162 * auVar94._0_4_ * auVar94._0_4_;
    auVar74._8_4_ = fVar219 * auVar94._8_4_ * auVar94._8_4_;
    auVar74._12_4_ = fVar221 * auVar94._12_4_ * auVar94._12_4_;
    auVar74._16_4_ = fVar223 * auVar95._16_4_ * auVar95._16_4_;
    auVar74._20_4_ = fVar225 * auVar95._20_4_ * auVar95._20_4_;
    auVar74._24_4_ = fVar227 * auVar95._24_4_ * auVar95._24_4_;
    auVar74._28_4_ = auVar95._28_4_;
    local_540 = *(uint *)(ray + k * 4 + 0x100);
    auVar46 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
    auVar187 = vandnps_avx(auVar126,auVar214);
    auVar197 = vcmpps_avx(auVar99,auVar74,1);
    auVar75._4_4_ = fVar178 * -fVar204;
    auVar75._0_4_ = fVar119 * -fVar200;
    auVar75._8_4_ = fVar190 * -fVar205;
    auVar75._12_4_ = fVar191 * -fVar206;
    auVar75._16_4_ = fVar192 * -fVar207;
    auVar75._20_4_ = fVar193 * -fVar208;
    auVar75._24_4_ = fVar194 * -fVar209;
    auVar75._28_4_ = auVar202._28_4_ + auVar55._28_4_;
    auVar197 = vblendvps_avx(auVar139,auVar75,auVar197);
    auVar187 = vblendvps_avx(auVar139,auVar197,auVar187);
    auVar231 = vminps_avx(_local_5e0,auVar187);
    auVar197 = vmaxps_avx(_local_5e0,auVar187);
    auVar239 = vminps_avx(local_440,auVar231);
    auVar202 = vcmpps_avx(auVar239,auVar231,0);
    auVar187 = vcmpps_avx(auVar197,auVar139,0);
    auVar167._8_4_ = 0xff800000;
    auVar167._0_8_ = 0xff800000ff800000;
    auVar167._12_4_ = 0xff800000;
    auVar167._16_4_ = 0xff800000;
    auVar167._20_4_ = 0xff800000;
    auVar167._24_4_ = 0xff800000;
    auVar167._28_4_ = 0xff800000;
    auVar187 = vblendvps_avx(auVar197,auVar167,auVar187);
    auVar197 = vcmpps_avx(auVar231,auVar139,0);
    auVar197 = vblendvps_avx(auVar231,auVar167,auVar197);
    auVar197 = vblendvps_avx(auVar197,auVar187,auVar202);
    auVar127._16_16_ = auVar46;
    auVar127._0_16_ = auVar46;
    auVar148._0_4_ = fVar104 + auVar239._0_4_;
    auVar148._4_4_ = fVar111 + auVar239._4_4_;
    auVar148._8_4_ = fStack_698 + auVar239._8_4_;
    auVar148._12_4_ = fStack_694 + auVar239._12_4_;
    auVar148._16_4_ = fStack_690 + auVar239._16_4_;
    auVar148._20_4_ = fStack_68c + auVar239._20_4_;
    auVar148._24_4_ = fStack_688 + auVar239._24_4_;
    auVar148._28_4_ = fStack_684 + auVar239._28_4_;
    auVar187 = vcmpps_avx(auVar127,auVar148,2);
    uStack_53c = 0;
    uStack_538 = 0;
    auVar46 = vshufps_avx(ZEXT416(local_540),ZEXT416(local_540),0);
    auVar185._16_16_ = auVar46;
    auVar185._0_16_ = auVar46;
    auVar202 = vcmpps_avx(auVar148,auVar185,2);
    auVar187 = vandps_avx(auVar202,auVar187);
    local_80 = vmaxps_avx(_local_600,auVar197);
    auVar197 = vcmpps_avx(auVar239,auVar139,4);
    auVar197 = vandps_avx(auVar214,auVar197);
    local_480 = vandps_avx(auVar187,auVar197);
    local_380._0_4_ = fVar104 + local_80._0_4_;
    local_380._4_4_ = fVar111 + local_80._4_4_;
    local_380._8_4_ = fStack_698 + local_80._8_4_;
    local_380._12_4_ = fStack_694 + local_80._12_4_;
    local_380._16_4_ = fStack_690 + local_80._16_4_;
    local_380._20_4_ = fStack_68c + local_80._20_4_;
    local_380._24_4_ = fStack_688 + local_80._24_4_;
    local_380._28_4_ = fStack_684 + local_80._28_4_;
    auVar187 = vcmpps_avx(auVar127,local_380,2);
    auVar197 = vcmpps_avx(local_380,auVar185,2);
    auVar187 = vandps_avx(auVar197,auVar187);
    auVar197 = vcmpps_avx(local_80,auVar167,4);
    auVar197 = vandps_avx(auVar214,auVar197);
    local_4a0 = vandps_avx(auVar187,auVar197);
    local_560 = vorps_avx(local_480,local_4a0);
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_560 >> 0x7f,0) != '\0') ||
          (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_560 >> 0xbf,0) != '\0') ||
        (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_560[0x1f] < '\0') {
      auVar202 = vblendvps_avx(local_80,auVar239,local_480);
      auVar231 = vblendvps_avx(_local_460,auVar184,local_480);
      auVar85._4_4_ = fVar112;
      auVar85._0_4_ = fVar105;
      auVar85._8_4_ = fVar113;
      auVar85._12_4_ = fVar114;
      auVar85._16_4_ = fVar115;
      auVar85._20_4_ = fVar116;
      auVar85._24_4_ = fVar117;
      auVar85._28_4_ = fVar118;
      auVar187 = vrcpps_avx(auVar85);
      local_520 = auVar187._0_4_;
      fStack_51c = auVar187._4_4_;
      auVar76._4_4_ = fVar112 * fStack_51c;
      auVar76._0_4_ = fVar105 * local_520;
      fStack_518 = auVar187._8_4_;
      auVar76._8_4_ = fVar113 * fStack_518;
      fStack_514 = auVar187._12_4_;
      auVar76._12_4_ = fVar114 * fStack_514;
      fStack_510 = auVar187._16_4_;
      auVar76._16_4_ = fVar115 * fStack_510;
      fStack_50c = auVar187._20_4_;
      auVar76._20_4_ = fVar116 * fStack_50c;
      fStack_508 = auVar187._24_4_;
      auVar76._24_4_ = fVar117 * fStack_508;
      auVar76._28_4_ = local_480._28_4_;
      auVar238._8_4_ = 0x3f800000;
      auVar238._0_8_ = 0x3f8000003f800000;
      auVar238._12_4_ = 0x3f800000;
      auVar238._16_4_ = 0x3f800000;
      auVar238._20_4_ = 0x3f800000;
      auVar238._24_4_ = 0x3f800000;
      auVar238._28_4_ = 0x3f800000;
      auVar197 = vsubps_avx(auVar238,auVar76);
      local_520 = local_520 + local_520 * auVar197._0_4_;
      fStack_51c = fStack_51c + fStack_51c * auVar197._4_4_;
      fStack_518 = fStack_518 + fStack_518 * auVar197._8_4_;
      fStack_514 = fStack_514 + fStack_514 * auVar197._12_4_;
      fStack_510 = fStack_510 + fStack_510 * auVar197._16_4_;
      fStack_50c = fStack_50c + fStack_50c * auVar197._20_4_;
      fStack_508 = fStack_508 + fStack_508 * auVar197._24_4_;
      fStack_504 = auVar187._28_4_ + auVar197._28_4_;
      fVar143 = fVar105 * fVar133 * fVar143;
      fVar150 = fVar112 * fVar15 * fVar150;
      fVar152 = fVar113 * fVar21 * fVar152;
      fVar154 = fVar114 * fVar27 * fVar154;
      fVar156 = fVar115 * fVar33 * fVar156;
      fVar158 = fVar116 * fVar39 * fVar158;
      fVar160 = fVar117 * fVar45 * fVar160;
      auVar240 = ZEXT3264(local_4e0);
      local_660 = fVar103 * fVar143;
      fStack_65c = fVar140 * fVar150;
      fStack_658 = fVar18 * fVar152;
      fStack_654 = fVar24 * fVar154;
      fStack_650 = fVar30 * fVar156;
      fStack_64c = fVar36 * fVar158;
      fStack_648 = fVar42 * fVar160;
      local_500 = fVar234 * fVar143;
      fStack_4fc = fVar135 * fVar150;
      fStack_4f8 = fVar17 * fVar152;
      fStack_4f4 = fVar23 * fVar154;
      fStack_4f0 = fVar29 * fVar156;
      fStack_4ec = fVar35 * fVar158;
      fStack_4e8 = fVar41 * fVar160;
      auVar187 = vcmpps_avx(local_440,auVar202,0);
      auVar197 = vcmpps_avx(auVar202,_local_600,0);
      auVar187 = vorps_avx(auVar187,auVar197);
      auVar187 = vandps_avx(auVar187,auVar214);
      auVar239 = vcmpps_avx(auVar202,_local_5e0,0);
      auVar197 = vandps_avx(auVar239,auVar214);
      fVar119 = auVar202._0_4_;
      fVar133 = auVar202._4_4_;
      fVar15 = auVar202._8_4_;
      fVar21 = auVar202._12_4_;
      fVar27 = auVar202._16_4_;
      fVar33 = auVar202._20_4_;
      fVar39 = auVar202._24_4_;
      auVar128._0_4_ = local_660 + fVar144 * (fStack_418 * fVar119 + fVar120);
      auVar128._4_4_ = fStack_65c + fVar151 * (fStack_418 * fVar133 + fVar142);
      auVar128._8_4_ = fStack_658 + fVar153 * (fStack_418 * fVar15 + fVar20);
      auVar128._12_4_ = fStack_654 + fVar155 * (fStack_418 * fVar21 + fVar26);
      auVar128._16_4_ = fStack_650 + fVar157 * (fStack_418 * fVar27 + fVar32);
      auVar128._20_4_ = fStack_64c + fVar159 * (fStack_418 * fVar33 + fVar38);
      auVar128._24_4_ = fStack_648 + fVar161 * (fStack_418 * fVar39 + fVar44);
      auVar128._28_4_ = fStack_644 + auVar239._28_4_ + uStack_5a8._4_4_;
      fStack_3dc = fVar140 * fStack_3bc;
      local_3e0 = fVar103 * local_3c0;
      fStack_3d8 = fVar18 * fStack_3b8;
      fStack_3d4 = fVar24 * fStack_3b4;
      fStack_3d0 = fVar30 * fStack_3b0;
      fStack_3cc = fVar36 * fStack_3ac;
      fStack_3c8 = fVar42 * fStack_3a8;
      fStack_3c4 = local_80._28_4_;
      fVar120 = auVar231._0_4_;
      fVar142 = auVar231._4_4_;
      auVar77._4_4_ = fVar140 * fStack_3bc * fVar142;
      auVar77._0_4_ = fVar103 * local_3c0 * fVar120;
      fVar103 = auVar231._8_4_;
      auVar77._8_4_ = fVar18 * fStack_3b8 * fVar103;
      fVar140 = auVar231._12_4_;
      auVar77._12_4_ = fVar24 * fStack_3b4 * fVar140;
      fVar20 = auVar231._16_4_;
      auVar77._16_4_ = fVar30 * fStack_3b0 * fVar20;
      fVar26 = auVar231._20_4_;
      auVar77._20_4_ = fVar36 * fStack_3ac * fVar26;
      fVar32 = auVar231._24_4_;
      auVar77._24_4_ = fVar42 * fStack_3a8 * fVar32;
      auVar77._28_4_ = auVar214._28_4_;
      auVar239 = vsubps_avx(auVar128,auVar77);
      auVar149._0_4_ = local_500 + fVar144 * (fStack_4e4 * fVar119 + fVar136);
      auVar149._4_4_ = fStack_4fc + fVar151 * (fStack_4e4 * fVar133 + fVar141);
      auVar149._8_4_ = fStack_4f8 + fVar153 * (fStack_4e4 * fVar15 + fVar19);
      auVar149._12_4_ = fStack_4f4 + fVar155 * (fStack_4e4 * fVar21 + fVar25);
      auVar149._16_4_ = fStack_4f0 + fVar157 * (fStack_4e4 * fVar27 + fVar31);
      auVar149._20_4_ = fStack_4ec + fVar159 * (fStack_4e4 * fVar33 + fVar37);
      auVar149._24_4_ = fStack_4e8 + fVar161 * (fStack_4e4 * fVar39 + fVar43);
      auVar149._28_4_ = fStack_4e4 + auVar214._28_4_ + (float)local_680._28_4_;
      fStack_3fc = fVar135 * fStack_3bc;
      local_400 = fVar234 * local_3c0;
      fStack_3f8 = fVar17 * fStack_3b8;
      fStack_3f4 = fVar23 * fStack_3b4;
      fStack_3f0 = fVar29 * fStack_3b0;
      fStack_3ec = fVar35 * fStack_3ac;
      fStack_3e8 = fVar41 * fStack_3a8;
      fStack_3e4 = fStack_418;
      auVar78._4_4_ = fVar135 * fStack_3bc * fVar142;
      auVar78._0_4_ = fVar234 * local_3c0 * fVar120;
      auVar78._8_4_ = fVar17 * fStack_3b8 * fVar103;
      auVar78._12_4_ = fVar23 * fStack_3b4 * fVar140;
      auVar78._16_4_ = fVar29 * fStack_3b0 * fVar20;
      auVar78._20_4_ = fVar35 * fStack_3ac * fVar26;
      auVar78._24_4_ = fVar41 * fStack_3a8 * fVar32;
      auVar78._28_4_ = fStack_4e4;
      auVar244 = vsubps_avx(auVar149,auVar78);
      local_e0._0_8_ = local_4e0._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar18;
      local_e0._12_4_ = -fVar24;
      local_e0._16_4_ = -fVar30;
      local_e0._20_4_ = -fVar36;
      local_e0._24_4_ = -fVar42;
      local_e0._28_4_ = -local_4e0._28_4_;
      auVar214 = vblendvps_avx(local_4e0,local_e0,auVar197);
      local_2e0 = vblendvps_avx(auVar214,auVar239,auVar187);
      auVar245 = ZEXT3264(_local_5a0);
      local_3c0 = fVar233 * local_3c0;
      fStack_3bc = fVar134 * fStack_3bc;
      fStack_3b8 = fVar16 * fStack_3b8;
      fStack_3b4 = fVar22 * fStack_3b4;
      fStack_3b0 = fVar28 * fStack_3b0;
      fStack_3ac = fVar34 * fStack_3ac;
      uStack_3a4 = auVar214._28_4_;
      fStack_3a8 = fVar40 * fStack_3a8;
      local_a0 = fVar233 * fVar143;
      fStack_9c = fVar134 * fVar150;
      fStack_98 = fVar16 * fVar152;
      fStack_94 = fVar22 * fVar154;
      fStack_90 = fVar28 * fVar156;
      fStack_8c = fVar34 * fVar158;
      fStack_88 = fVar40 * fVar160;
      fStack_84 = local_e0._28_4_;
      auVar186._0_4_ = fVar233 * fVar143 + fVar144 * (fVar210 + (float)local_580._4_4_ * fVar119);
      auVar186._4_4_ = fVar134 * fVar150 + fVar151 * (fVar216 + (float)local_580._4_4_ * fVar133);
      auVar186._8_4_ = fVar16 * fVar152 + fVar153 * (fVar218 + (float)local_580._4_4_ * fVar15);
      auVar186._12_4_ = fVar22 * fVar154 + fVar155 * (fVar220 + (float)local_580._4_4_ * fVar21);
      auVar186._16_4_ = fVar28 * fVar156 + fVar157 * (fVar222 + (float)local_580._4_4_ * fVar27);
      auVar186._20_4_ = fVar34 * fVar158 + fVar159 * (fVar224 + (float)local_580._4_4_ * fVar33);
      auVar186._24_4_ = fVar40 * fVar160 + fVar161 * (fVar226 + (float)local_580._4_4_ * fVar39);
      auVar186._28_4_ = local_e0._28_4_ + fStack_644 + fVar118;
      auVar79._4_4_ = fStack_3bc * fVar142;
      auVar79._0_4_ = local_3c0 * fVar120;
      auVar79._8_4_ = fStack_3b8 * fVar103;
      auVar79._12_4_ = fStack_3b4 * fVar140;
      auVar79._16_4_ = fStack_3b0 * fVar20;
      auVar79._20_4_ = fStack_3ac * fVar26;
      auVar79._24_4_ = fStack_3a8 * fVar32;
      auVar79._28_4_ = uStack_3a4;
      local_100._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar17;
      local_100._12_4_ = -fVar23;
      local_100._16_4_ = -fVar29;
      local_100._20_4_ = -fVar35;
      local_100._24_4_ = -fVar41;
      local_100._28_4_ = local_3a0._28_4_ ^ 0x80000000;
      auVar214 = vblendvps_avx(local_3a0,local_100,auVar197);
      auVar239 = vsubps_avx(auVar186,auVar79);
      local_2c0 = vblendvps_avx(auVar214,auVar244,auVar187);
      local_120._0_8_ = local_5a0 ^ 0x8000000080000000;
      local_120._8_4_ = -fVar16;
      local_120._12_4_ = -fVar22;
      local_120._16_4_ = -fVar28;
      local_120._20_4_ = -fVar34;
      local_120._24_4_ = -fVar40;
      local_120._28_4_ = -fVar56;
      auVar214 = vblendvps_avx(_local_5a0,local_120,auVar197);
      local_2a0 = vblendvps_avx(auVar214,auVar239,auVar187);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar100._16_4_ = 0x3f800000;
      auVar100._20_4_ = 0x3f800000;
      auVar100._24_4_ = 0x3f800000;
      auVar100._28_4_ = 0x3f800000;
      local_c0 = vblendvps_avx(auVar100,ZEXT832(0) << 0x20,auVar197);
      auVar80._4_4_ = fVar142 * fStack_51c;
      auVar80._0_4_ = fVar120 * local_520;
      auVar80._8_4_ = fVar103 * fStack_518;
      auVar80._12_4_ = fVar140 * fStack_514;
      auVar80._16_4_ = fVar20 * fStack_510;
      auVar80._20_4_ = fVar26 * fStack_50c;
      auVar80._24_4_ = fVar32 * fStack_508;
      auVar80._28_4_ = auVar231._28_4_;
      local_340 = vblendvps_avx(local_c0,auVar80,auVar187);
      local_300._0_4_ = fVar119 + fVar104;
      local_300._4_4_ = fVar133 + fVar111;
      local_300._8_4_ = fVar15 + fStack_698;
      local_300._12_4_ = fVar21 + fStack_694;
      local_300._16_4_ = fVar27 + fStack_690;
      local_300._20_4_ = fVar33 + fStack_68c;
      local_300._24_4_ = fVar39 + fStack_688;
      local_300._28_4_ = auVar202._28_4_ + fStack_684;
      local_320 = ZEXT832(0) << 0x20;
      uVar90 = vmovmskps_avx(local_560);
      uVar92 = CONCAT44((int)((ulong)lVar91 >> 0x20),uVar90);
      uVar88 = 1 << ((byte)k & 0x1f);
      local_6a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
      auVar199 = ZEXT3264(_local_580);
      auVar189 = ZEXT3264(local_3a0);
      auVar232 = ZEXT3264(local_680);
      auVar215 = ZEXT3264(local_4c0);
      auVar203 = ZEXT3264(_local_5c0);
      local_6a8 = pSVar89;
      local_640 = line;
      local_638 = k;
      fStack_414 = fStack_418;
      fStack_410 = fStack_418;
      fStack_40c = fStack_418;
      fStack_408 = fStack_418;
      fStack_404 = fStack_418;
      do {
        auVar197 = auVar199._0_32_;
        auVar187 = auVar189._0_32_;
        local_630.valid = (int *)local_6e0;
        auVar214 = auVar215._0_32_;
        auVar202 = auVar203._0_32_;
        auVar244 = auVar245._0_32_;
        auVar239 = auVar240._0_32_;
        auVar231 = auVar232._0_32_;
        uVar14 = 0;
        if (uVar92 != 0) {
          for (; (uVar92 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        uVar2 = *(uint *)(local_360 + uVar14 * 4);
        pGVar10 = (pSVar89->geometries).items[uVar2].ptr;
        local_630.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar93 = true, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_010f3fa8;
          local_1e0 = *(undefined4 *)(local_340 + uVar14 * 4);
          local_1c0 = *(undefined4 *)(local_320 + uVar14 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar14 * 4);
          local_630.context = context->user;
          local_170 = vpshufd_avx(ZEXT416(uVar2),0);
          local_1a0 = (local_640->primIDs).field_0.i[uVar14];
          local_240 = *(undefined4 *)(local_2e0 + uVar14 * 4);
          local_220._4_4_ = *(undefined4 *)(local_2c0 + uVar14 * 4);
          local_200._4_4_ = *(undefined4 *)(local_2a0 + uVar14 * 4);
          uStack_23c = local_240;
          uStack_238 = local_240;
          uStack_234 = local_240;
          uStack_230 = local_240;
          uStack_22c = local_240;
          uStack_228 = local_240;
          uStack_224 = local_240;
          local_220._0_4_ = local_220._4_4_;
          local_220._8_4_ = local_220._4_4_;
          local_220._12_4_ = local_220._4_4_;
          local_220._16_4_ = local_220._4_4_;
          local_220._20_4_ = local_220._4_4_;
          local_220._24_4_ = local_220._4_4_;
          local_220._28_4_ = local_220._4_4_;
          local_200._0_4_ = local_200._4_4_;
          local_200._8_4_ = local_200._4_4_;
          local_200._12_4_ = local_200._4_4_;
          local_200._16_4_ = local_200._4_4_;
          local_200._20_4_ = local_200._4_4_;
          local_200._24_4_ = local_200._4_4_;
          local_200._28_4_ = local_200._4_4_;
          uStack_1dc = local_1e0;
          uStack_1d8 = local_1e0;
          uStack_1d4 = local_1e0;
          uStack_1d0 = local_1e0;
          uStack_1cc = local_1e0;
          uStack_1c8 = local_1e0;
          uStack_1c4 = local_1e0;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          local_180 = local_170;
          auVar187 = vcmpps_avx(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xf);
          uStack_15c = (local_630.context)->instID[0];
          local_160 = uStack_15c;
          uStack_158 = uStack_15c;
          uStack_154 = uStack_15c;
          uStack_150 = uStack_15c;
          uStack_14c = uStack_15c;
          uStack_148 = uStack_15c;
          uStack_144 = uStack_15c;
          uStack_13c = (local_630.context)->instPrimID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          local_6e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
          local_6d0 = *local_6a0;
          local_630.geometryUserPtr = pGVar10->userPtr;
          local_630.hit = (RTCHitN *)&local_240;
          local_630.N = 8;
          if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_560 = auVar187;
            (*pGVar10->occlusionFilterN)(&local_630);
            auVar240 = ZEXT3264(local_4e0);
            auVar203 = ZEXT3264(_local_5c0);
            auVar215 = ZEXT3264(local_4c0);
            auVar232 = ZEXT3264(local_680);
            auVar245 = ZEXT3264(_local_5a0);
            auVar189 = ZEXT3264(local_3a0);
            auVar199 = ZEXT3264(_local_580);
            pSVar89 = local_6a8;
            auVar187 = local_560;
          }
          auVar121 = ZEXT816(0) << 0x40;
          auVar46 = vpcmpeqd_avx(local_6e0,auVar121);
          auVar47 = vpcmpeqd_avx(local_6d0,auVar121);
          auVar129._16_16_ = auVar47;
          auVar129._0_16_ = auVar46;
          auVar197 = auVar187 & ~auVar129;
          if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar197 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar197 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar197 >> 0x7f,0) == '\0') &&
                (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar197 >> 0xbf,0) == '\0') &&
              (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar197[0x1f]) {
            auVar101._0_4_ = auVar46._0_4_ ^ auVar187._0_4_;
            auVar101._4_4_ = auVar46._4_4_ ^ auVar187._4_4_;
            auVar101._8_4_ = auVar46._8_4_ ^ auVar187._8_4_;
            auVar101._12_4_ = auVar46._12_4_ ^ auVar187._12_4_;
            auVar101._16_4_ = auVar47._0_4_ ^ auVar187._16_4_;
            auVar101._20_4_ = auVar47._4_4_ ^ auVar187._20_4_;
            auVar101._24_4_ = auVar47._8_4_ ^ auVar187._24_4_;
            auVar101._28_4_ = auVar47._12_4_ ^ auVar187._28_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_560 = auVar187;
              (*p_Var13)(&local_630);
              auVar121 = ZEXT816(0) << 0x40;
              auVar240 = ZEXT3264(local_4e0);
              auVar203 = ZEXT3264(_local_5c0);
              auVar215 = ZEXT3264(local_4c0);
              auVar232 = ZEXT3264(local_680);
              auVar245 = ZEXT3264(_local_5a0);
              auVar189 = ZEXT3264(local_3a0);
              auVar199 = ZEXT3264(_local_580);
              pSVar89 = local_6a8;
              auVar187 = local_560;
            }
            auVar46 = vpcmpeqd_avx(local_6e0,auVar121);
            auVar47 = vpcmpeqd_avx(local_6d0,auVar121);
            auVar108._16_16_ = auVar47;
            auVar108._0_16_ = auVar46;
            auVar101._0_4_ = auVar46._0_4_ ^ auVar187._0_4_;
            auVar101._4_4_ = auVar46._4_4_ ^ auVar187._4_4_;
            auVar101._8_4_ = auVar46._8_4_ ^ auVar187._8_4_;
            auVar101._12_4_ = auVar46._12_4_ ^ auVar187._12_4_;
            auVar101._16_4_ = auVar47._0_4_ ^ auVar187._16_4_;
            auVar101._20_4_ = auVar47._4_4_ ^ auVar187._20_4_;
            auVar101._24_4_ = auVar47._8_4_ ^ auVar187._24_4_;
            auVar101._28_4_ = auVar47._12_4_ ^ auVar187._28_4_;
            auVar130._8_4_ = 0xff800000;
            auVar130._0_8_ = 0xff800000ff800000;
            auVar130._12_4_ = 0xff800000;
            auVar130._16_4_ = 0xff800000;
            auVar130._20_4_ = 0xff800000;
            auVar130._24_4_ = 0xff800000;
            auVar130._28_4_ = 0xff800000;
            auVar187 = vblendvps_avx(auVar130,*(undefined1 (*) [32])(local_630.ray + 0x100),auVar108
                                    );
            *(undefined1 (*) [32])(local_630.ray + 0x100) = auVar187;
          }
          auVar197 = auVar199._0_32_;
          auVar187 = auVar189._0_32_;
          auVar214 = auVar215._0_32_;
          auVar202 = auVar203._0_32_;
          auVar244 = auVar245._0_32_;
          auVar239 = auVar240._0_32_;
          auVar231 = auVar232._0_32_;
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar101 >> 0x7f,0) != '\0') ||
                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0xbf,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar101[0x1f] < '\0') {
            local_540 = *(uint *)(ray + k * 4 + 0x100);
            uStack_53c = 0;
            uStack_538 = 0;
            bVar93 = true;
            goto LAB_010f3fa8;
          }
          *(uint *)(ray + k * 4 + 0x100) = local_540;
        }
        auVar197 = auVar199._0_32_;
        auVar187 = auVar189._0_32_;
        auVar214 = auVar215._0_32_;
        auVar202 = auVar203._0_32_;
        auVar244 = auVar245._0_32_;
        auVar239 = auVar240._0_32_;
        auVar231 = auVar232._0_32_;
        uVar92 = uVar92 ^ 1L << (uVar14 & 0x3f);
      } while (uVar92 != 0);
      bVar93 = false;
LAB_010f3fa8:
      auVar52 = vandps_avx(local_4a0,local_480);
      auVar46._4_4_ = uStack_53c;
      auVar46._0_4_ = local_540;
      auVar46._8_8_ = uStack_538;
      auVar46 = vpermilps_avx(auVar46,0);
      auVar109._16_16_ = auVar46;
      auVar109._0_16_ = auVar46;
      auVar55 = vcmpps_avx(local_380,auVar109,2);
      auVar48 = auVar52 & auVar55;
      if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar48 >> 0x7f,0) == '\0') &&
            (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar48 >> 0xbf,0) == '\0') &&
          (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar48[0x1f])
      {
        return bVar93;
      }
      auVar49 = vcmpps_avx(local_80,_local_5e0,0);
      auVar239 = vblendvps_avx(auVar239,local_e0,auVar49);
      auVar48 = vblendvps_avx(auVar187,local_100,auVar49);
      auVar244 = vblendvps_avx(auVar244,local_120,auVar49);
      auVar49 = vcmpps_avx(local_80,local_440,0);
      auVar50 = vcmpps_avx(local_80,_local_600,0);
      auVar49 = vorps_avx(auVar49,auVar50);
      fVar119 = local_80._0_4_;
      fVar233 = local_80._4_4_;
      fVar234 = local_80._8_4_;
      fVar103 = local_80._12_4_;
      fVar136 = local_80._16_4_;
      fVar120 = local_80._20_4_;
      fVar133 = local_80._24_4_;
      auVar177._0_4_ = (float)local_260._0_4_ * (auVar202._0_4_ + fVar119 * local_420) + local_660;
      auVar177._4_4_ = (float)local_260._4_4_ * (auVar202._4_4_ + fVar233 * fStack_41c) + fStack_65c
      ;
      auVar177._8_4_ = fStack_258 * (auVar202._8_4_ + fVar234 * fStack_418) + fStack_658;
      auVar177._12_4_ = fStack_254 * (auVar202._12_4_ + fVar103 * fStack_414) + fStack_654;
      auVar177._16_4_ = fStack_250 * (auVar202._16_4_ + fVar136 * fStack_410) + fStack_650;
      auVar177._20_4_ = fStack_24c * (auVar202._20_4_ + fVar120 * fStack_40c) + fStack_64c;
      auVar177._24_4_ = fStack_248 * (auVar202._24_4_ + fVar133 * fStack_408) + fStack_648;
      auVar177._28_4_ = auVar202._28_4_ + auVar50._28_4_ + fStack_644;
      auVar188._0_4_ = (float)local_260._0_4_ * (auVar231._0_4_ + fVar119 * local_280) + local_500;
      auVar188._4_4_ = (float)local_260._4_4_ * (auVar231._4_4_ + fVar233 * fStack_27c) + fStack_4fc
      ;
      auVar188._8_4_ = fStack_258 * (auVar231._8_4_ + fVar234 * fStack_278) + fStack_4f8;
      auVar188._12_4_ = fStack_254 * (auVar231._12_4_ + fVar103 * fStack_274) + fStack_4f4;
      auVar188._16_4_ = fStack_250 * (auVar231._16_4_ + fVar136 * fStack_270) + fStack_4f0;
      auVar188._20_4_ = fStack_24c * (auVar231._20_4_ + fVar120 * fStack_26c) + fStack_4ec;
      auVar188._24_4_ = fStack_248 * (auVar231._24_4_ + fVar133 * fStack_268) + fStack_4e8;
      auVar188._28_4_ = auVar231._28_4_ + auVar187._28_4_ + fStack_4e4;
      auVar198._0_4_ =
           (float)local_260._0_4_ * (auVar214._0_4_ + auVar197._0_4_ * fVar119) + local_a0;
      auVar198._4_4_ =
           (float)local_260._4_4_ * (auVar214._4_4_ + auVar197._4_4_ * fVar233) + fStack_9c;
      auVar198._8_4_ = fStack_258 * (auVar214._8_4_ + auVar197._8_4_ * fVar234) + fStack_98;
      auVar198._12_4_ = fStack_254 * (auVar214._12_4_ + auVar197._12_4_ * fVar103) + fStack_94;
      auVar198._16_4_ = fStack_250 * (auVar214._16_4_ + auVar197._16_4_ * fVar136) + fStack_90;
      auVar198._20_4_ = fStack_24c * (auVar214._20_4_ + auVar197._20_4_ * fVar120) + fStack_8c;
      auVar198._24_4_ = fStack_248 * (auVar214._24_4_ + auVar197._24_4_ * fVar133) + fStack_88;
      auVar198._28_4_ = auVar214._28_4_ + auVar197._28_4_ + fStack_84;
      auVar81._4_4_ = (float)local_460._4_4_ * fStack_3dc;
      auVar81._0_4_ = (float)local_460._0_4_ * local_3e0;
      auVar81._8_4_ = fStack_458 * fStack_3d8;
      auVar81._12_4_ = fStack_454 * fStack_3d4;
      auVar81._16_4_ = fStack_450 * fStack_3d0;
      auVar81._20_4_ = fStack_44c * fStack_3cc;
      auVar81._24_4_ = fStack_448 * fStack_3c8;
      auVar81._28_4_ = uStack_244;
      auVar187 = vsubps_avx(auVar177,auVar81);
      auVar82._4_4_ = (float)local_460._4_4_ * fStack_3fc;
      auVar82._0_4_ = (float)local_460._0_4_ * local_400;
      auVar82._8_4_ = fStack_458 * fStack_3f8;
      auVar82._12_4_ = fStack_454 * fStack_3f4;
      auVar82._16_4_ = fStack_450 * fStack_3f0;
      auVar82._20_4_ = fStack_44c * fStack_3ec;
      auVar82._24_4_ = fStack_448 * fStack_3e8;
      auVar82._28_4_ = uStack_244;
      auVar197 = vsubps_avx(auVar188,auVar82);
      auVar83._4_4_ = (float)local_460._4_4_ * fStack_3bc;
      auVar83._0_4_ = (float)local_460._0_4_ * local_3c0;
      auVar83._8_4_ = fStack_458 * fStack_3b8;
      auVar83._12_4_ = fStack_454 * fStack_3b4;
      auVar83._16_4_ = fStack_450 * fStack_3b0;
      auVar83._20_4_ = fStack_44c * fStack_3ac;
      auVar83._24_4_ = fStack_448 * fStack_3a8;
      auVar83._28_4_ = uStack_244;
      auVar202 = vsubps_avx(auVar198,auVar83);
      local_2e0 = vblendvps_avx(auVar239,auVar187,auVar49);
      local_2c0 = vblendvps_avx(auVar48,auVar197,auVar49);
      local_2a0 = vblendvps_avx(auVar244,auVar202,auVar49);
      auVar84._4_4_ = (float)local_460._4_4_ * fStack_51c;
      auVar84._0_4_ = (float)local_460._0_4_ * local_520;
      auVar84._8_4_ = fStack_458 * fStack_518;
      auVar84._12_4_ = fStack_454 * fStack_514;
      auVar84._16_4_ = fStack_450 * fStack_510;
      auVar84._20_4_ = fStack_44c * fStack_50c;
      auVar84._24_4_ = fStack_448 * fStack_508;
      auVar84._28_4_ = auVar187._28_4_;
      local_340 = vblendvps_avx(local_c0,auVar84,auVar49);
      auVar187 = vandps_avx(auVar55,auVar52);
      auVar189 = ZEXT864(0) << 0x20;
      local_320 = ZEXT832(0) << 0x20;
      local_300 = local_380;
      pSVar89 = context->scene;
      uVar90 = vmovmskps_avx(auVar187);
      uVar92 = CONCAT44((int)(uVar14 >> 0x20),uVar90);
      auVar199 = ZEXT864(0) << 0x20;
      do {
        local_630.valid = (int *)local_6e0;
        uVar14 = 0;
        if (uVar92 != 0) {
          for (; (uVar92 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        uVar2 = *(uint *)(local_360 + uVar14 * 4);
        pGVar10 = (pSVar89->geometries).items[uVar2].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar86 = 1, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_010f4420;
          local_1e0 = *(undefined4 *)(local_340 + uVar14 * 4);
          local_1c0 = *(undefined4 *)(local_320 + uVar14 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar14 * 4);
          local_630.context = context->user;
          local_170 = vpshufd_avx(ZEXT416(uVar2),0);
          local_1a0 = (local_640->primIDs).field_0.i[uVar14];
          local_240 = *(undefined4 *)(local_2e0 + uVar14 * 4);
          uVar90 = *(undefined4 *)(local_2c0 + uVar14 * 4);
          local_220._4_4_ = uVar90;
          local_220._0_4_ = uVar90;
          local_220._8_4_ = uVar90;
          local_220._12_4_ = uVar90;
          local_220._16_4_ = uVar90;
          local_220._20_4_ = uVar90;
          local_220._24_4_ = uVar90;
          local_220._28_4_ = uVar90;
          uVar90 = *(undefined4 *)(local_2a0 + uVar14 * 4);
          local_200._4_4_ = uVar90;
          local_200._0_4_ = uVar90;
          local_200._8_4_ = uVar90;
          local_200._12_4_ = uVar90;
          local_200._16_4_ = uVar90;
          local_200._20_4_ = uVar90;
          local_200._24_4_ = uVar90;
          local_200._28_4_ = uVar90;
          uStack_23c = local_240;
          uStack_238 = local_240;
          uStack_234 = local_240;
          uStack_230 = local_240;
          uStack_22c = local_240;
          uStack_228 = local_240;
          uStack_224 = local_240;
          uStack_1dc = local_1e0;
          uStack_1d8 = local_1e0;
          uStack_1d4 = local_1e0;
          uStack_1d0 = local_1e0;
          uStack_1cc = local_1e0;
          uStack_1c8 = local_1e0;
          uStack_1c4 = local_1e0;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          local_180 = local_170;
          local_680 = vcmpps_avx(auVar189._0_32_,auVar189._0_32_,0xf);
          uStack_15c = (local_630.context)->instID[0];
          local_160 = uStack_15c;
          uStack_158 = uStack_15c;
          uStack_154 = uStack_15c;
          uStack_150 = uStack_15c;
          uStack_14c = uStack_15c;
          uStack_148 = uStack_15c;
          uStack_144 = uStack_15c;
          uStack_13c = (local_630.context)->instPrimID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          local_6e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
          local_6d0 = *local_6a0;
          local_630.geometryUserPtr = pGVar10->userPtr;
          local_630.hit = (RTCHitN *)&local_240;
          local_630.N = 8;
          local_630.ray = (RTCRayN *)ray;
          if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_660 = SUB84(pSVar89,0);
            fStack_65c = (float)((ulong)pSVar89 >> 0x20);
            (*pGVar10->occlusionFilterN)(&local_630);
            auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
            pSVar89 = (Scene *)CONCAT44(fStack_65c,local_660);
            auVar189 = ZEXT1664(ZEXT816(0) << 0x40);
            k = local_638;
          }
          auVar46 = vpcmpeqd_avx(auVar199._0_16_,local_6e0);
          auVar47 = vpcmpeqd_avx(auVar199._0_16_,local_6d0);
          auVar131._16_16_ = auVar47;
          auVar131._0_16_ = auVar46;
          auVar187 = local_680 & ~auVar131;
          if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar187 >> 0x7f,0) == '\0') &&
                (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar187 >> 0xbf,0) == '\0') &&
              (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar187[0x1f]) {
            auVar102._0_4_ = auVar46._0_4_ ^ local_680._0_4_;
            auVar102._4_4_ = auVar46._4_4_ ^ local_680._4_4_;
            auVar102._8_4_ = auVar46._8_4_ ^ local_680._8_4_;
            auVar102._12_4_ = auVar46._12_4_ ^ local_680._12_4_;
            auVar102._16_4_ = auVar47._0_4_ ^ local_680._16_4_;
            auVar102._20_4_ = auVar47._4_4_ ^ local_680._20_4_;
            auVar102._24_4_ = auVar47._8_4_ ^ local_680._24_4_;
            auVar102._28_4_ = auVar47._12_4_ ^ local_680._28_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_660 = SUB84(pSVar89,0);
              fStack_65c = (float)((ulong)pSVar89 >> 0x20);
              (*p_Var13)(&local_630);
              auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
              pSVar89 = (Scene *)CONCAT44(fStack_65c,local_660);
              auVar189 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar46 = vpcmpeqd_avx(auVar199._0_16_,local_6e0);
            auVar47 = vpcmpeqd_avx(auVar199._0_16_,local_6d0);
            auVar110._16_16_ = auVar47;
            auVar110._0_16_ = auVar46;
            auVar102._0_4_ = auVar46._0_4_ ^ local_680._0_4_;
            auVar102._4_4_ = auVar46._4_4_ ^ local_680._4_4_;
            auVar102._8_4_ = auVar46._8_4_ ^ local_680._8_4_;
            auVar102._12_4_ = auVar46._12_4_ ^ local_680._12_4_;
            auVar102._16_4_ = auVar47._0_4_ ^ local_680._16_4_;
            auVar102._20_4_ = auVar47._4_4_ ^ local_680._20_4_;
            auVar102._24_4_ = auVar47._8_4_ ^ local_680._24_4_;
            auVar102._28_4_ = auVar47._12_4_ ^ local_680._28_4_;
            auVar132._8_4_ = 0xff800000;
            auVar132._0_8_ = 0xff800000ff800000;
            auVar132._12_4_ = 0xff800000;
            auVar132._16_4_ = 0xff800000;
            auVar132._20_4_ = 0xff800000;
            auVar132._24_4_ = 0xff800000;
            auVar132._28_4_ = 0xff800000;
            auVar187 = vblendvps_avx(auVar132,*(undefined1 (*) [32])(local_630.ray + 0x100),auVar110
                                    );
            *(undefined1 (*) [32])(local_630.ray + 0x100) = auVar187;
          }
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0x7f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0xbf,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar102[0x1f] < '\0') {
            bVar86 = 1;
            goto LAB_010f4420;
          }
          *(uint *)(ray + k * 4 + 0x100) = local_540;
        }
        uVar92 = uVar92 ^ 1L << (uVar14 & 0x3f);
        if (uVar92 == 0) {
          bVar86 = 0;
LAB_010f4420:
          return (bool)(bVar93 | bVar86);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }